

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  ulong uVar72;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined4 uVar73;
  undefined8 unaff_R12;
  ulong uVar74;
  bool bVar75;
  undefined4 uVar76;
  undefined8 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar80 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar118;
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar111 [32];
  float fVar120;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar124;
  undefined1 auVar129 [16];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar130 [32];
  float fVar140;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [28];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar242;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  float fVar243;
  undefined1 auVar244 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar245 [32];
  float fVar249;
  undefined1 auVar246 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar259 [64];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b2c;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  RTCFilterFunctionNArguments local_ab8;
  int local_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_970;
  float local_968;
  float local_964;
  undefined4 local_960;
  uint local_95c;
  uint local_958;
  uint local_954;
  uint local_950;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  Primitive *local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar5 = prim[1];
  uVar68 = (ulong)(byte)PVar5;
  fVar229 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar8 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                      *(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar191._0_4_ = fVar229 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar191._4_4_ = fVar229 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar191._8_4_ = fVar229 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar191._12_4_ = fVar229 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar68 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar3);
  auVar78._0_4_ = fVar229 * auVar8._0_4_;
  auVar78._4_4_ = fVar229 * auVar8._4_4_;
  auVar78._8_4_ = fVar229 * auVar8._8_4_;
  auVar78._12_4_ = fVar229 * auVar8._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar68 * 5 + 6);
  auVar268 = vpmovsxbd_avx2(auVar8);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar68 * 6 + 6);
  auVar9 = vpmovsxbd_avx2(auVar169);
  auVar268 = vcvtdq2ps_avx(auVar268);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar10 = vpmovsxbd_avx2(auVar183);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar68 * 0xc + 6);
  auVar165 = vpmovsxbd_avx2(auVar82);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar131 = vpmovsxbd_avx2(auVar192);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar177 = vpmovsxbd_avx2(auVar217);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar68 * 0x13 + 6);
  auVar160 = vpmovsxbd_avx2(auVar128);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar11 = vpmovsxbd_avx2(auVar4);
  auVar90 = vcvtdq2ps_avx(auVar160);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar250._4_4_ = auVar191._0_4_;
  auVar250._0_4_ = auVar191._0_4_;
  auVar250._8_4_ = auVar191._0_4_;
  auVar250._12_4_ = auVar191._0_4_;
  auVar250._16_4_ = auVar191._0_4_;
  auVar250._20_4_ = auVar191._0_4_;
  auVar250._24_4_ = auVar191._0_4_;
  auVar250._28_4_ = auVar191._0_4_;
  auVar3 = vmovshdup_avx(auVar191);
  uVar77 = auVar3._0_8_;
  auVar265._8_8_ = uVar77;
  auVar265._0_8_ = uVar77;
  auVar265._16_8_ = uVar77;
  auVar265._24_8_ = uVar77;
  auVar3 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar229 = auVar3._0_4_;
  auVar234._0_4_ = fVar229 * auVar9._0_4_;
  fVar124 = auVar3._4_4_;
  auVar234._4_4_ = fVar124 * auVar9._4_4_;
  auVar234._8_4_ = fVar229 * auVar9._8_4_;
  auVar234._12_4_ = fVar124 * auVar9._12_4_;
  auVar234._16_4_ = fVar229 * auVar9._16_4_;
  auVar234._20_4_ = fVar124 * auVar9._20_4_;
  auVar234._28_36_ = in_ZMM10._28_36_;
  auVar234._24_4_ = fVar229 * auVar9._24_4_;
  auVar203._4_4_ = auVar131._4_4_ * fVar124;
  auVar203._0_4_ = auVar131._0_4_ * fVar229;
  auVar203._8_4_ = auVar131._8_4_ * fVar229;
  auVar203._12_4_ = auVar131._12_4_ * fVar124;
  auVar203._16_4_ = auVar131._16_4_ * fVar229;
  auVar203._20_4_ = auVar131._20_4_ * fVar124;
  auVar203._24_4_ = auVar131._24_4_ * fVar229;
  auVar203._28_4_ = auVar160._28_4_;
  auVar212._0_4_ = auVar11._0_4_ * fVar229;
  auVar212._4_4_ = auVar11._4_4_ * fVar124;
  auVar212._8_4_ = auVar11._8_4_ * fVar229;
  auVar212._12_4_ = auVar11._12_4_ * fVar124;
  auVar212._16_4_ = auVar11._16_4_ * fVar229;
  auVar212._20_4_ = auVar11._20_4_ * fVar124;
  auVar212._24_4_ = auVar11._24_4_ * fVar229;
  auVar212._28_4_ = 0;
  auVar3 = vfmadd231ps_fma(auVar234._0_32_,auVar265,auVar268);
  auVar8 = vfmadd231ps_fma(auVar203,auVar265,auVar165);
  auVar169 = vfmadd231ps_fma(auVar212,auVar90,auVar265);
  auVar183 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar250,auVar88);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar250,auVar10);
  auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar177,auVar250);
  auVar251._4_4_ = auVar78._0_4_;
  auVar251._0_4_ = auVar78._0_4_;
  auVar251._8_4_ = auVar78._0_4_;
  auVar251._12_4_ = auVar78._0_4_;
  auVar251._16_4_ = auVar78._0_4_;
  auVar251._20_4_ = auVar78._0_4_;
  auVar251._24_4_ = auVar78._0_4_;
  auVar251._28_4_ = auVar78._0_4_;
  auVar3 = vmovshdup_avx(auVar78);
  uVar77 = auVar3._0_8_;
  auVar266._8_8_ = uVar77;
  auVar266._0_8_ = uVar77;
  auVar266._16_8_ = uVar77;
  auVar266._24_8_ = uVar77;
  auVar3 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar229 = auVar3._0_4_;
  auVar194._0_4_ = fVar229 * auVar9._0_4_;
  fVar124 = auVar3._4_4_;
  auVar194._4_4_ = fVar124 * auVar9._4_4_;
  auVar194._8_4_ = fVar229 * auVar9._8_4_;
  auVar194._12_4_ = fVar124 * auVar9._12_4_;
  auVar194._16_4_ = fVar229 * auVar9._16_4_;
  auVar194._20_4_ = fVar124 * auVar9._20_4_;
  auVar194._24_4_ = fVar229 * auVar9._24_4_;
  auVar194._28_4_ = 0;
  auVar160._4_4_ = auVar131._4_4_ * fVar124;
  auVar160._0_4_ = auVar131._0_4_ * fVar229;
  auVar160._8_4_ = auVar131._8_4_ * fVar229;
  auVar160._12_4_ = auVar131._12_4_ * fVar124;
  auVar160._16_4_ = auVar131._16_4_ * fVar229;
  auVar160._20_4_ = auVar131._20_4_ * fVar124;
  auVar160._24_4_ = auVar131._24_4_ * fVar229;
  auVar160._28_4_ = auVar9._28_4_;
  auVar9._4_4_ = auVar11._4_4_ * fVar124;
  auVar9._0_4_ = auVar11._0_4_ * fVar229;
  auVar9._8_4_ = auVar11._8_4_ * fVar229;
  auVar9._12_4_ = auVar11._12_4_ * fVar124;
  auVar9._16_4_ = auVar11._16_4_ * fVar229;
  auVar9._20_4_ = auVar11._20_4_ * fVar124;
  auVar9._24_4_ = auVar11._24_4_ * fVar229;
  auVar9._28_4_ = fVar124;
  auVar3 = vfmadd231ps_fma(auVar194,auVar266,auVar268);
  auVar82 = vfmadd231ps_fma(auVar160,auVar266,auVar165);
  auVar192 = vfmadd231ps_fma(auVar9,auVar266,auVar90);
  auVar217 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar251,auVar88);
  local_660._8_4_ = 0x7fffffff;
  local_660._0_8_ = 0x7fffffff7fffffff;
  local_660._12_4_ = 0x7fffffff;
  local_660._16_4_ = 0x7fffffff;
  local_660._20_4_ = 0x7fffffff;
  local_660._24_4_ = 0x7fffffff;
  local_660._28_4_ = 0x7fffffff;
  auVar234 = ZEXT3264(local_660);
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  auVar245._16_4_ = 0x219392ef;
  auVar245._20_4_ = 0x219392ef;
  auVar245._24_4_ = 0x219392ef;
  auVar245._28_4_ = 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar183),local_660);
  auVar88 = vcmpps_avx(auVar88,auVar245,1);
  auVar268 = vblendvps_avx(ZEXT1632(auVar183),auVar245,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar8),local_660);
  auVar88 = vcmpps_avx(auVar88,auVar245,1);
  auVar9 = vblendvps_avx(ZEXT1632(auVar8),auVar245,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar169),local_660);
  auVar88 = vcmpps_avx(auVar88,auVar245,1);
  auVar88 = vblendvps_avx(ZEXT1632(auVar169),auVar245,auVar88);
  auVar183 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar251,auVar10);
  auVar10 = vrcpps_avx(auVar268);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar251,auVar177);
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = 0x3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar213._16_4_ = 0x3f800000;
  auVar213._20_4_ = 0x3f800000;
  auVar213._24_4_ = 0x3f800000;
  auVar213._28_4_ = 0x3f800000;
  auVar3 = vfnmadd213ps_fma(auVar268,auVar10,auVar213);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar10,auVar10);
  auVar268 = vrcpps_avx(auVar9);
  auVar8 = vfnmadd213ps_fma(auVar9,auVar268,auVar213);
  auVar9 = vrcpps_avx(auVar88);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar268,auVar268);
  auVar169 = vfnmadd213ps_fma(auVar88,auVar9,auVar213);
  auVar169 = vfmadd132ps_fma(ZEXT1632(auVar169),auVar9,auVar9);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar217));
  auVar10._4_4_ = auVar3._4_4_ * auVar88._4_4_;
  auVar10._0_4_ = auVar3._0_4_ * auVar88._0_4_;
  auVar10._8_4_ = auVar3._8_4_ * auVar88._8_4_;
  auVar10._12_4_ = auVar3._12_4_ * auVar88._12_4_;
  auVar10._16_4_ = auVar88._16_4_ * 0.0;
  auVar10._20_4_ = auVar88._20_4_ * 0.0;
  auVar10._24_4_ = auVar88._24_4_ * 0.0;
  auVar10._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar217));
  auVar165._4_4_ = auVar3._4_4_ * auVar88._4_4_;
  auVar165._0_4_ = auVar3._0_4_ * auVar88._0_4_;
  auVar165._8_4_ = auVar3._8_4_ * auVar88._8_4_;
  auVar165._12_4_ = auVar3._12_4_ * auVar88._12_4_;
  auVar165._16_4_ = auVar88._16_4_ * 0.0;
  auVar165._20_4_ = auVar88._20_4_ * 0.0;
  auVar165._24_4_ = auVar88._24_4_ * 0.0;
  auVar165._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0xe + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar183));
  auVar131._4_4_ = auVar8._4_4_ * auVar88._4_4_;
  auVar131._0_4_ = auVar8._0_4_ * auVar88._0_4_;
  auVar131._8_4_ = auVar8._8_4_ * auVar88._8_4_;
  auVar131._12_4_ = auVar8._12_4_ * auVar88._12_4_;
  auVar131._16_4_ = auVar88._16_4_ * 0.0;
  auVar131._20_4_ = auVar88._20_4_ * 0.0;
  auVar131._24_4_ = auVar88._24_4_ * 0.0;
  auVar131._28_4_ = auVar88._28_4_;
  auVar111._1_3_ = 0;
  auVar111[0] = PVar5;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar183));
  auVar268 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x15 + 6));
  auVar177._4_4_ = auVar8._4_4_ * auVar88._4_4_;
  auVar177._0_4_ = auVar8._0_4_ * auVar88._0_4_;
  auVar177._8_4_ = auVar8._8_4_ * auVar88._8_4_;
  auVar177._12_4_ = auVar8._12_4_ * auVar88._12_4_;
  auVar177._16_4_ = auVar88._16_4_ * 0.0;
  auVar177._20_4_ = auVar88._20_4_ * 0.0;
  auVar177._24_4_ = auVar88._24_4_ * 0.0;
  auVar177._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar268);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar82));
  auVar90._4_4_ = auVar88._4_4_ * auVar169._4_4_;
  auVar90._0_4_ = auVar88._0_4_ * auVar169._0_4_;
  auVar90._8_4_ = auVar88._8_4_ * auVar169._8_4_;
  auVar90._12_4_ = auVar88._12_4_ * auVar169._12_4_;
  auVar90._16_4_ = auVar88._16_4_ * 0.0;
  auVar90._20_4_ = auVar88._20_4_ * 0.0;
  auVar90._24_4_ = auVar88._24_4_ * 0.0;
  auVar90._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar82));
  auVar11._4_4_ = auVar169._4_4_ * auVar88._4_4_;
  auVar11._0_4_ = auVar169._0_4_ * auVar88._0_4_;
  auVar11._8_4_ = auVar169._8_4_ * auVar88._8_4_;
  auVar11._12_4_ = auVar169._12_4_ * auVar88._12_4_;
  auVar11._16_4_ = auVar88._16_4_ * 0.0;
  auVar11._20_4_ = auVar88._20_4_ * 0.0;
  auVar11._24_4_ = auVar88._24_4_ * 0.0;
  auVar11._28_4_ = auVar88._28_4_;
  auVar88 = vpminsd_avx2(auVar10,auVar165);
  auVar268 = vpminsd_avx2(auVar131,auVar177);
  auVar88 = vmaxps_avx(auVar88,auVar268);
  auVar268 = vpminsd_avx2(auVar90,auVar11);
  uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar218._4_4_ = uVar73;
  auVar218._0_4_ = uVar73;
  auVar218._8_4_ = uVar73;
  auVar218._12_4_ = uVar73;
  auVar218._16_4_ = uVar73;
  auVar218._20_4_ = uVar73;
  auVar218._24_4_ = uVar73;
  auVar218._28_4_ = uVar73;
  auVar268 = vmaxps_avx(auVar268,auVar218);
  auVar88 = vmaxps_avx(auVar88,auVar268);
  local_3a0._4_4_ = auVar88._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar88._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar88._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar88._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar88._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar88._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar88._24_4_ * 0.99999964;
  local_3a0._28_4_ = 0x3f7ffffa;
  auVar88 = vpmaxsd_avx2(auVar10,auVar165);
  auVar268 = vpmaxsd_avx2(auVar131,auVar177);
  auVar88 = vminps_avx(auVar88,auVar268);
  auVar268 = vpmaxsd_avx2(auVar90,auVar11);
  fVar229 = (ray->super_RayK<1>).tfar;
  auVar130._4_4_ = fVar229;
  auVar130._0_4_ = fVar229;
  auVar130._8_4_ = fVar229;
  auVar130._12_4_ = fVar229;
  auVar130._16_4_ = fVar229;
  auVar130._20_4_ = fVar229;
  auVar130._24_4_ = fVar229;
  auVar130._28_4_ = fVar229;
  auVar268 = vminps_avx(auVar268,auVar130);
  auVar88 = vminps_avx(auVar88,auVar268);
  auVar268._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar268._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar268._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar268._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar268._16_4_ = auVar88._16_4_ * 1.0000004;
  auVar268._20_4_ = auVar88._20_4_ * 1.0000004;
  auVar268._24_4_ = auVar88._24_4_ * 1.0000004;
  auVar268._28_4_ = auVar88._28_4_;
  auVar111[4] = PVar5;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar5;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar5;
  auVar111._13_3_ = 0;
  auVar111[0x10] = PVar5;
  auVar111._17_3_ = 0;
  auVar111[0x14] = PVar5;
  auVar111._21_3_ = 0;
  auVar111[0x18] = PVar5;
  auVar111._25_3_ = 0;
  auVar111[0x1c] = PVar5;
  auVar111._29_3_ = 0;
  auVar88 = vcmpps_avx(local_3a0,auVar268,2);
  auVar268 = vpcmpgtd_avx2(auVar111,_DAT_01fb4ba0);
  auVar88 = vandps_avx(auVar88,auVar268);
  uVar73 = vmovmskps_avx(auVar88);
  uVar74 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar73);
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_788 = prim;
LAB_012bc50c:
  if (uVar74 == 0) {
    return;
  }
  lVar70 = 0;
  for (uVar69 = uVar74; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar74 = uVar74 - 1 & uVar74;
  uVar73 = *(undefined4 *)(local_788 + lVar70 * 4 + 6);
  uVar69 = (ulong)(uint)((int)lVar70 << 6);
  auVar3 = *(undefined1 (*) [16])(prim + uVar69 + uVar68 * 0x19 + 0x16);
  if (uVar74 != 0) {
    uVar72 = uVar74 - 1 & uVar74;
    for (uVar13 = uVar74; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = *(undefined1 (*) [16])(prim + uVar69 + uVar68 * 0x19 + 0x26);
  auVar169 = *(undefined1 (*) [16])(prim + uVar69 + uVar68 * 0x19 + 0x36);
  auVar183 = *(undefined1 (*) [16])(prim + uVar69 + uVar68 * 0x19 + 0x46);
  auVar180._0_4_ = (auVar3._0_4_ + auVar8._0_4_ + auVar169._0_4_ + auVar183._0_4_) * 0.25;
  auVar180._4_4_ = (auVar3._4_4_ + auVar8._4_4_ + auVar169._4_4_ + auVar183._4_4_) * 0.25;
  auVar180._8_4_ = (auVar3._8_4_ + auVar8._8_4_ + auVar169._8_4_ + auVar183._8_4_) * 0.25;
  auVar180._12_4_ = (auVar3._12_4_ + auVar8._12_4_ + auVar169._12_4_ + auVar183._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar82 = vsubps_avx(auVar180,(undefined1  [16])aVar1);
  auVar82 = vdpps_avx(auVar82,(undefined1  [16])aVar2,0x7f);
  auVar192 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  uVar67 = *(uint *)(local_788 + 2);
  auVar217 = vrcpss_avx(auVar192,auVar192);
  auVar192 = vfnmadd213ss_fma(auVar217,auVar192,ZEXT416(0x40000000));
  fVar229 = auVar82._0_4_ * auVar217._0_4_ * auVar192._0_4_;
  local_7a0 = ZEXT416((uint)fVar229);
  auVar181._4_4_ = fVar229;
  auVar181._0_4_ = fVar229;
  auVar181._8_4_ = fVar229;
  auVar181._12_4_ = fVar229;
  fStack_7f0 = fVar229;
  _local_800 = auVar181;
  fStack_7ec = fVar229;
  fStack_7e8 = fVar229;
  fStack_7e4 = fVar229;
  auVar82 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar181);
  auVar82 = vblendps_avx(auVar82,_DAT_01f45a50,8);
  local_a50 = vsubps_avx(auVar3,auVar82);
  local_a60 = vsubps_avx(auVar169,auVar82);
  local_a70 = vsubps_avx(auVar8,auVar82);
  _local_a80 = vsubps_avx(auVar183,auVar82);
  auVar3 = vmovshdup_avx(local_a50);
  local_1e0 = auVar3._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar3 = vshufps_avx(local_a50,local_a50,0xaa);
  uVar77 = auVar3._0_8_;
  auVar214._8_8_ = uVar77;
  auVar214._0_8_ = uVar77;
  auVar214._16_8_ = uVar77;
  auVar214._24_8_ = uVar77;
  auVar3 = vshufps_avx(local_a50,local_a50,0xff);
  uVar77 = auVar3._0_8_;
  local_8a0._8_8_ = uVar77;
  local_8a0._0_8_ = uVar77;
  local_8a0._16_8_ = uVar77;
  local_8a0._24_8_ = uVar77;
  auVar254 = ZEXT3264(local_8a0);
  auVar3 = vmovshdup_avx(local_a70);
  uVar77 = auVar3._0_8_;
  local_a00._8_8_ = uVar77;
  local_a00._0_8_ = uVar77;
  local_a00._16_8_ = uVar77;
  local_a00._24_8_ = uVar77;
  auVar228 = ZEXT3264(local_a00);
  auVar3 = vshufps_avx(local_a70,local_a70,0xaa);
  uVar77 = auVar3._0_8_;
  auVar209._8_8_ = uVar77;
  auVar209._0_8_ = uVar77;
  auVar209._16_8_ = uVar77;
  auVar209._24_8_ = uVar77;
  auVar211 = ZEXT3264(auVar209);
  auVar8 = vshufps_avx(local_a70,local_a70,0xff);
  uVar77 = auVar8._0_8_;
  auVar267._8_8_ = uVar77;
  auVar267._0_8_ = uVar77;
  auVar267._16_8_ = uVar77;
  auVar267._24_8_ = uVar77;
  auVar3 = vmovshdup_avx(local_a60);
  uVar77 = auVar3._0_8_;
  local_7e0._8_8_ = uVar77;
  local_7e0._0_8_ = uVar77;
  local_7e0._16_8_ = uVar77;
  local_7e0._24_8_ = uVar77;
  auVar259 = ZEXT3264(local_7e0);
  auVar3 = vshufps_avx(local_a60,local_a60,0xaa);
  local_460 = auVar3._0_4_;
  fStack_45c = auVar3._4_4_;
  auVar3 = vshufps_avx(local_a60,local_a60,0xff);
  local_480 = auVar3._0_4_;
  fStack_47c = auVar3._4_4_;
  auVar3 = vmovshdup_avx(_local_a80);
  local_200 = auVar3._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar3 = vshufps_avx(_local_a80,_local_a80,0xaa);
  local_220 = auVar3._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar3 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_240 = auVar3._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar79._0_4_ = aVar2.x * aVar2.x;
  auVar79._4_4_ = aVar2.y * aVar2.y;
  auVar79._8_4_ = aVar2.z * aVar2.z;
  auVar79._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar3 = vshufps_avx(auVar79,auVar79,0xaa);
  auVar89._0_8_ = auVar3._0_8_;
  auVar89._8_8_ = auVar89._0_8_;
  auVar89._16_8_ = auVar89._0_8_;
  auVar89._24_8_ = auVar89._0_8_;
  uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_560._4_4_ = uVar76;
  local_560._0_4_ = uVar76;
  fStack_558 = (float)uVar76;
  fStack_554 = (float)uVar76;
  fStack_550 = (float)uVar76;
  fStack_54c = (float)uVar76;
  fStack_548 = (float)uVar76;
  register0x0000125c = uVar76;
  uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_580._4_4_ = uVar76;
  local_580._0_4_ = uVar76;
  fStack_578 = (float)uVar76;
  fStack_574 = (float)uVar76;
  fStack_570 = (float)uVar76;
  fStack_56c = (float)uVar76;
  fStack_568 = (float)uVar76;
  register0x0000135c = uVar76;
  auVar3 = vfmadd231ps_fma(auVar89,_local_580,_local_580);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_560,_local_560);
  uVar69 = 0;
  local_b2c = 1;
  local_5a0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  uVar76 = local_a50._0_4_;
  local_360._4_4_ = uVar76;
  local_360._0_4_ = uVar76;
  local_360._8_4_ = uVar76;
  local_360._12_4_ = uVar76;
  local_360._16_4_ = uVar76;
  local_360._20_4_ = uVar76;
  local_360._24_4_ = uVar76;
  local_360._28_4_ = uVar76;
  uVar76 = local_a70._0_4_;
  local_8e0._4_4_ = uVar76;
  local_8e0._0_4_ = uVar76;
  local_8e0._8_4_ = uVar76;
  local_8e0._12_4_ = uVar76;
  local_8e0._16_4_ = uVar76;
  local_8e0._20_4_ = uVar76;
  local_8e0._24_4_ = uVar76;
  local_8e0._28_4_ = uVar76;
  auVar223 = ZEXT3264(local_8e0);
  local_280 = local_a60._0_4_;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  local_380 = local_a80._0_4_;
  local_260 = ZEXT1632(auVar3);
  local_4a0 = vandps_avx(ZEXT1632(auVar3),local_660);
  local_530 = ZEXT816(0x3f80000000000000);
  local_880 = auVar214;
  local_8c0 = auVar209;
  fStack_37c = local_380;
  fStack_378 = local_380;
  fStack_374 = local_380;
  fStack_370 = local_380;
  fStack_36c = local_380;
  fStack_368 = local_380;
  fStack_364 = local_380;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  do {
    auVar158._8_4_ = 0x3f800000;
    auVar158._0_8_ = 0x3f8000003f800000;
    auVar158._12_4_ = 0x3f800000;
    auVar158._16_4_ = 0x3f800000;
    auVar158._20_4_ = 0x3f800000;
    auVar158._24_4_ = 0x3f800000;
    auVar158._28_4_ = 0x3f800000;
    auVar3 = vmovshdup_avx(local_530);
    auVar3 = vsubps_avx(auVar3,local_530);
    fVar237 = auVar3._0_4_;
    fVar143 = fVar237 * 0.04761905;
    local_6c0._0_4_ = local_530._0_4_;
    local_6c0._4_4_ = local_6c0._0_4_;
    local_6c0._8_4_ = local_6c0._0_4_;
    local_6c0._12_4_ = local_6c0._0_4_;
    local_6c0._16_4_ = local_6c0._0_4_;
    local_6c0._20_4_ = local_6c0._0_4_;
    local_6c0._24_4_ = local_6c0._0_4_;
    local_6c0._28_4_ = local_6c0._0_4_;
    local_6e0._4_4_ = fVar237;
    local_6e0._0_4_ = fVar237;
    local_6e0._8_4_ = fVar237;
    local_6e0._12_4_ = fVar237;
    local_6e0._16_4_ = fVar237;
    local_6e0._20_4_ = fVar237;
    local_6e0._24_4_ = fVar237;
    local_6e0._28_4_ = fVar237;
    auVar3 = vfmadd231ps_fma(local_6c0,local_6e0,_DAT_01f7b040);
    auVar88 = vsubps_avx(auVar158,ZEXT1632(auVar3));
    fVar229 = auVar3._0_4_;
    auVar235._0_4_ = auVar223._0_4_ * fVar229;
    fVar124 = auVar3._4_4_;
    auVar235._4_4_ = auVar223._4_4_ * fVar124;
    fVar236 = auVar3._8_4_;
    auVar235._8_4_ = auVar223._8_4_ * fVar236;
    fVar138 = auVar3._12_4_;
    auVar235._12_4_ = auVar223._12_4_ * fVar138;
    auVar235._16_4_ = auVar223._16_4_ * 0.0;
    auVar235._20_4_ = auVar223._20_4_ * 0.0;
    auVar235._28_36_ = auVar234._28_36_;
    auVar235._24_4_ = auVar223._24_4_ * 0.0;
    auVar199._0_4_ = auVar228._0_4_ * fVar229;
    auVar199._4_4_ = auVar228._4_4_ * fVar124;
    auVar199._8_4_ = auVar228._8_4_ * fVar236;
    auVar199._12_4_ = auVar228._12_4_ * fVar138;
    auVar199._16_4_ = auVar228._16_4_ * 0.0;
    auVar199._20_4_ = auVar228._20_4_ * 0.0;
    auVar199._28_36_ = auVar211._28_36_;
    auVar199._24_4_ = auVar228._24_4_ * 0.0;
    auVar14._4_4_ = auVar209._4_4_ * fVar124;
    auVar14._0_4_ = auVar209._0_4_ * fVar229;
    auVar14._8_4_ = auVar209._8_4_ * fVar236;
    auVar14._12_4_ = auVar209._12_4_ * fVar138;
    auVar14._16_4_ = auVar209._16_4_ * 0.0;
    auVar14._20_4_ = auVar209._20_4_ * 0.0;
    auVar14._24_4_ = auVar209._24_4_ * 0.0;
    auVar14._28_4_ = 0x3f800000;
    fVar238 = auVar8._0_4_;
    fVar271 = auVar8._4_4_;
    auVar15._4_4_ = fVar271 * fVar124;
    auVar15._0_4_ = fVar238 * fVar229;
    auVar15._8_4_ = fVar238 * fVar236;
    auVar15._12_4_ = fVar271 * fVar138;
    auVar15._16_4_ = fVar238 * 0.0;
    auVar15._20_4_ = fVar271 * 0.0;
    auVar15._24_4_ = fVar238 * 0.0;
    auVar15._28_4_ = fVar237;
    auVar3 = vfmadd231ps_fma(auVar235._0_32_,auVar88,local_360);
    auVar62._8_8_ = uStack_1d8;
    auVar62._0_8_ = local_1e0;
    auVar62._16_8_ = uStack_1d0;
    auVar62._24_8_ = uStack_1c8;
    auVar169 = vfmadd231ps_fma(auVar199._0_32_,auVar88,auVar62);
    auVar183 = vfmadd231ps_fma(auVar14,auVar88,auVar214);
    auVar82 = vfmadd231ps_fma(auVar15,auVar88,auVar254._0_32_);
    auVar61._4_4_ = fStack_27c;
    auVar61._0_4_ = local_280;
    auVar61._8_4_ = fStack_278;
    auVar61._12_4_ = fStack_274;
    auVar61._16_4_ = fStack_270;
    auVar61._20_4_ = fStack_26c;
    auVar61._24_4_ = fStack_268;
    auVar61._28_4_ = fStack_264;
    auVar16._4_4_ = fStack_27c * fVar124;
    auVar16._0_4_ = local_280 * fVar229;
    auVar16._8_4_ = fStack_278 * fVar236;
    auVar16._12_4_ = fStack_274 * fVar138;
    auVar16._16_4_ = fStack_270 * 0.0;
    auVar16._20_4_ = fStack_26c * 0.0;
    auVar16._24_4_ = fStack_268 * 0.0;
    auVar16._28_4_ = auVar214._28_4_;
    auVar17._4_4_ = auVar259._4_4_ * fVar124;
    auVar17._0_4_ = auVar259._0_4_ * fVar229;
    auVar17._8_4_ = auVar259._8_4_ * fVar236;
    auVar17._12_4_ = auVar259._12_4_ * fVar138;
    auVar17._16_4_ = auVar259._16_4_ * 0.0;
    auVar17._20_4_ = auVar259._20_4_ * 0.0;
    auVar17._24_4_ = auVar259._24_4_ * 0.0;
    auVar17._28_4_ = local_360._28_4_;
    auVar63._4_4_ = fVar124 * fStack_45c;
    auVar63._0_4_ = fVar229 * local_460;
    auVar63._8_4_ = fVar236 * fStack_458;
    auVar63._12_4_ = fVar138 * fStack_454;
    auVar63._16_4_ = fStack_450 * 0.0;
    auVar63._20_4_ = fStack_44c * 0.0;
    auVar63._24_4_ = fStack_448 * 0.0;
    auVar63._28_4_ = DAT_01f7b040._28_4_;
    auVar159._0_4_ = fVar229 * local_480;
    auVar159._4_4_ = fVar124 * fStack_47c;
    auVar159._8_4_ = fVar236 * fStack_478;
    auVar159._12_4_ = fVar138 * fStack_474;
    auVar159._16_4_ = fStack_470 * 0.0;
    auVar159._20_4_ = fStack_46c * 0.0;
    auVar159._24_4_ = fStack_468 * 0.0;
    auVar159._28_4_ = 0;
    auVar192 = vfmadd231ps_fma(auVar16,auVar88,auVar223._0_32_);
    auVar217 = vfmadd231ps_fma(auVar17,auVar88,auVar228._0_32_);
    auVar128 = vfmadd231ps_fma(auVar63,auVar88,auVar209);
    auVar4 = vfmadd231ps_fma(auVar159,auVar88,auVar267);
    auVar255._0_4_ = local_380 * fVar229;
    auVar255._4_4_ = fStack_37c * fVar124;
    auVar255._8_4_ = fStack_378 * fVar236;
    auVar255._12_4_ = fStack_374 * fVar138;
    auVar255._16_4_ = fStack_370 * 0.0;
    auVar255._20_4_ = fStack_36c * 0.0;
    auVar255._28_36_ = auVar254._28_36_;
    auVar255._24_4_ = fStack_368 * 0.0;
    auVar18._4_4_ = fVar124 * local_200._4_4_;
    auVar18._0_4_ = fVar229 * (float)local_200;
    auVar18._8_4_ = fVar236 * (float)uStack_1f8;
    auVar18._12_4_ = fVar138 * uStack_1f8._4_4_;
    auVar18._16_4_ = (float)uStack_1f0 * 0.0;
    auVar18._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar18._24_4_ = (float)uStack_1e8 * 0.0;
    auVar18._28_4_ = fStack_364;
    auVar19._28_4_ = auVar209._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar192._12_4_ * fVar138,
                            CONCAT48(auVar192._8_4_ * fVar236,
                                     CONCAT44(auVar192._4_4_ * fVar124,auVar192._0_4_ * fVar229))));
    auVar3 = vfmadd231ps_fma(auVar19,auVar88,ZEXT1632(auVar3));
    auVar169 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar138 * auVar217._12_4_,
                                                  CONCAT48(fVar236 * auVar217._8_4_,
                                                           CONCAT44(fVar124 * auVar217._4_4_,
                                                                    fVar229 * auVar217._0_4_)))),
                               auVar88,ZEXT1632(auVar169));
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(fVar138 * auVar128._12_4_,
                            CONCAT48(fVar236 * auVar128._8_4_,
                                     CONCAT44(fVar124 * auVar128._4_4_,fVar229 * auVar128._0_4_))));
    auVar183 = vfmadd231ps_fma(auVar228._0_32_,auVar88,ZEXT1632(auVar183));
    auVar211._28_36_ = auVar223._28_36_;
    auVar211._0_28_ =
         ZEXT1628(CONCAT412(fVar138 * auVar4._12_4_,
                            CONCAT48(fVar236 * auVar4._8_4_,
                                     CONCAT44(fVar124 * auVar4._4_4_,fVar229 * auVar4._0_4_))));
    auVar82 = vfmadd231ps_fma(auVar211._0_32_,auVar88,ZEXT1632(auVar82));
    auVar202._0_4_ = fVar229 * (float)local_220;
    auVar202._4_4_ = fVar124 * local_220._4_4_;
    auVar202._8_4_ = fVar236 * (float)uStack_218;
    auVar202._12_4_ = fVar138 * uStack_218._4_4_;
    auVar202._16_4_ = (float)uStack_210 * 0.0;
    auVar202._20_4_ = uStack_210._4_4_ * 0.0;
    auVar202._24_4_ = (float)uStack_208 * 0.0;
    auVar202._28_4_ = 0;
    auVar78 = vfmadd231ps_fma(auVar255._0_32_,auVar88,auVar61);
    auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar78._12_4_ * fVar138,
                                                  CONCAT48(auVar78._8_4_ * fVar236,
                                                           CONCAT44(auVar78._4_4_ * fVar124,
                                                                    auVar78._0_4_ * fVar229)))),
                               auVar88,ZEXT1632(auVar192));
    auVar215._0_4_ = fVar229 * (float)local_240;
    auVar215._4_4_ = fVar124 * local_240._4_4_;
    auVar215._8_4_ = fVar236 * (float)uStack_238;
    auVar215._12_4_ = fVar138 * uStack_238._4_4_;
    auVar215._16_4_ = (float)uStack_230 * 0.0;
    auVar215._20_4_ = uStack_230._4_4_ * 0.0;
    auVar215._24_4_ = (float)uStack_228 * 0.0;
    auVar215._28_4_ = 0;
    auVar78 = vfmadd231ps_fma(auVar18,auVar88,auVar259._0_32_);
    auVar58._4_4_ = fStack_45c;
    auVar58._0_4_ = local_460;
    auVar58._8_4_ = fStack_458;
    auVar58._12_4_ = fStack_454;
    auVar58._16_4_ = fStack_450;
    auVar58._20_4_ = fStack_44c;
    auVar58._24_4_ = fStack_448;
    auVar58._28_4_ = fStack_444;
    auVar191 = vfmadd231ps_fma(auVar202,auVar88,auVar58);
    auVar57._4_4_ = fStack_47c;
    auVar57._0_4_ = local_480;
    auVar57._8_4_ = fStack_478;
    auVar57._12_4_ = fStack_474;
    auVar57._16_4_ = fStack_470;
    auVar57._20_4_ = fStack_46c;
    auVar57._24_4_ = fStack_468;
    auVar57._28_4_ = fStack_464;
    auVar79 = vfmadd231ps_fma(auVar215,auVar88,auVar57);
    auVar223._28_36_ = auVar259._28_36_;
    auVar223._0_28_ =
         ZEXT1628(CONCAT412(auVar79._12_4_ * fVar138,
                            CONCAT48(auVar79._8_4_ * fVar236,
                                     CONCAT44(auVar79._4_4_ * fVar124,auVar79._0_4_ * fVar229))));
    auVar217 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar78._12_4_ * fVar138,
                                                  CONCAT48(auVar78._8_4_ * fVar236,
                                                           CONCAT44(auVar78._4_4_ * fVar124,
                                                                    auVar78._0_4_ * fVar229)))),
                               auVar88,ZEXT1632(auVar217));
    auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar138 * auVar191._12_4_,
                                                  CONCAT48(fVar236 * auVar191._8_4_,
                                                           CONCAT44(fVar124 * auVar191._4_4_,
                                                                    fVar229 * auVar191._0_4_)))),
                               auVar88,ZEXT1632(auVar128));
    auVar4 = vfmadd231ps_fma(auVar223._0_32_,auVar88,ZEXT1632(auVar4));
    auVar65._28_4_ = fVar271;
    auVar65._0_28_ =
         ZEXT1628(CONCAT412(fVar138 * auVar128._12_4_,
                            CONCAT48(fVar236 * auVar128._8_4_,
                                     CONCAT44(fVar124 * auVar128._4_4_,fVar229 * auVar128._0_4_))));
    auVar20._28_4_ = fStack_264;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar138,
                            CONCAT48(auVar4._8_4_ * fVar236,
                                     CONCAT44(auVar4._4_4_ * fVar124,auVar4._0_4_ * fVar229))));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * fVar138,
                                                 CONCAT48(auVar192._8_4_ * fVar236,
                                                          CONCAT44(auVar192._4_4_ * fVar124,
                                                                   auVar192._0_4_ * fVar229)))),
                              auVar88,ZEXT1632(auVar3));
    auVar191 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar217._12_4_ * fVar138,
                                                  CONCAT48(auVar217._8_4_ * fVar236,
                                                           CONCAT44(auVar217._4_4_ * fVar124,
                                                                    auVar217._0_4_ * fVar229)))),
                               auVar88,ZEXT1632(auVar169));
    auVar79 = vfmadd231ps_fma(auVar65,auVar88,ZEXT1632(auVar183));
    auVar180 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar82),auVar88);
    auVar10 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar3));
    auVar268 = vsubps_avx(ZEXT1632(auVar217),ZEXT1632(auVar169));
    auVar88 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar183));
    auVar9 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar82));
    local_9a0._0_4_ = fVar143 * auVar10._0_4_ * 3.0;
    local_9a0._4_4_ = fVar143 * auVar10._4_4_ * 3.0;
    local_9a0._8_4_ = fVar143 * auVar10._8_4_ * 3.0;
    local_9a0._12_4_ = fVar143 * auVar10._12_4_ * 3.0;
    local_9a0._16_4_ = fVar143 * auVar10._16_4_ * 3.0;
    local_9a0._20_4_ = fVar143 * auVar10._20_4_ * 3.0;
    local_9a0._24_4_ = fVar143 * auVar10._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    local_6a0._0_4_ = fVar143 * auVar268._0_4_ * 3.0;
    local_6a0._4_4_ = fVar143 * auVar268._4_4_ * 3.0;
    local_6a0._8_4_ = fVar143 * auVar268._8_4_ * 3.0;
    local_6a0._12_4_ = fVar143 * auVar268._12_4_ * 3.0;
    local_6a0._16_4_ = fVar143 * auVar268._16_4_ * 3.0;
    local_6a0._20_4_ = fVar143 * auVar268._20_4_ * 3.0;
    local_6a0._24_4_ = fVar143 * auVar268._24_4_ * 3.0;
    local_6a0._28_4_ = 0;
    fVar98 = fVar143 * auVar88._0_4_ * 3.0;
    fVar118 = fVar143 * auVar88._4_4_ * 3.0;
    local_9c0._4_4_ = fVar118;
    local_9c0._0_4_ = fVar98;
    fVar119 = fVar143 * auVar88._8_4_ * 3.0;
    local_9c0._8_4_ = fVar119;
    fVar120 = fVar143 * auVar88._12_4_ * 3.0;
    local_9c0._12_4_ = fVar120;
    fVar121 = fVar143 * auVar88._16_4_ * 3.0;
    local_9c0._16_4_ = fVar121;
    fVar122 = fVar143 * auVar88._20_4_ * 3.0;
    local_9c0._20_4_ = fVar122;
    fVar123 = fVar143 * auVar88._24_4_ * 3.0;
    local_9c0._24_4_ = fVar123;
    local_9c0._28_4_ = auVar10._28_4_;
    fVar124 = fVar143 * auVar9._0_4_ * 3.0;
    fVar138 = fVar143 * auVar9._4_4_ * 3.0;
    auVar21._4_4_ = fVar138;
    auVar21._0_4_ = fVar124;
    fVar139 = fVar143 * auVar9._8_4_ * 3.0;
    auVar21._8_4_ = fVar139;
    fVar140 = fVar143 * auVar9._12_4_ * 3.0;
    auVar21._12_4_ = fVar140;
    fVar141 = fVar143 * auVar9._16_4_ * 3.0;
    auVar21._16_4_ = fVar141;
    fVar142 = fVar143 * auVar9._20_4_ * 3.0;
    auVar21._20_4_ = fVar142;
    fVar143 = fVar143 * auVar9._24_4_ * 3.0;
    auVar21._24_4_ = fVar143;
    auVar21._28_4_ = auVar268._28_4_;
    auVar160 = ZEXT1632(auVar78);
    local_a20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar78));
    local_840 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar191));
    _local_7c0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar79));
    local_2c0 = vsubps_avx(local_a20,auVar160);
    local_2a0 = vsubps_avx(_local_7c0,ZEXT1632(auVar79));
    fVar229 = local_2a0._0_4_;
    fVar236 = local_2a0._4_4_;
    auVar22._4_4_ = local_9a0._4_4_ * fVar236;
    auVar22._0_4_ = local_9a0._0_4_ * fVar229;
    fVar237 = local_2a0._8_4_;
    auVar22._8_4_ = local_9a0._8_4_ * fVar237;
    fVar238 = local_2a0._12_4_;
    auVar22._12_4_ = local_9a0._12_4_ * fVar238;
    fVar239 = local_2a0._16_4_;
    auVar22._16_4_ = local_9a0._16_4_ * fVar239;
    fVar240 = local_2a0._20_4_;
    auVar22._20_4_ = local_9a0._20_4_ * fVar240;
    fVar241 = local_2a0._24_4_;
    auVar22._24_4_ = local_9a0._24_4_ * fVar241;
    auVar22._28_4_ = local_a20._28_4_;
    auVar3 = vfmsub231ps_fma(auVar22,local_9c0,local_2c0);
    local_2e0 = vsubps_avx(local_840,ZEXT1632(auVar191));
    fVar248 = local_2c0._0_4_;
    fVar249 = local_2c0._4_4_;
    auVar23._4_4_ = fVar249 * local_6a0._4_4_;
    auVar23._0_4_ = fVar248 * local_6a0._0_4_;
    fVar260 = local_2c0._8_4_;
    auVar23._8_4_ = fVar260 * local_6a0._8_4_;
    fVar261 = local_2c0._12_4_;
    auVar23._12_4_ = fVar261 * local_6a0._12_4_;
    fVar262 = local_2c0._16_4_;
    auVar23._16_4_ = fVar262 * local_6a0._16_4_;
    fVar263 = local_2c0._20_4_;
    auVar23._20_4_ = fVar263 * local_6a0._20_4_;
    fVar264 = local_2c0._24_4_;
    auVar23._24_4_ = fVar264 * local_6a0._24_4_;
    auVar23._28_4_ = local_840._28_4_;
    auVar169 = vfmsub231ps_fma(auVar23,local_9a0,local_2e0);
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar169._12_4_ * auVar169._12_4_,
                                                CONCAT48(auVar169._8_4_ * auVar169._8_4_,
                                                         CONCAT44(auVar169._4_4_ * auVar169._4_4_,
                                                                  auVar169._0_4_ * auVar169._0_4_)))
                                     ),ZEXT1632(auVar3),ZEXT1632(auVar3));
    fVar272 = local_2e0._0_4_;
    auVar161._0_4_ = fVar272 * fVar98;
    fVar273 = local_2e0._4_4_;
    auVar161._4_4_ = fVar273 * fVar118;
    fVar274 = local_2e0._8_4_;
    auVar161._8_4_ = fVar274 * fVar119;
    fVar275 = local_2e0._12_4_;
    auVar161._12_4_ = fVar275 * fVar120;
    fVar242 = local_2e0._16_4_;
    auVar161._16_4_ = fVar242 * fVar121;
    fVar243 = local_2e0._20_4_;
    auVar161._20_4_ = fVar243 * fVar122;
    fVar247 = local_2e0._24_4_;
    auVar161._24_4_ = fVar247 * fVar123;
    auVar161._28_4_ = 0;
    auVar169 = vfmsub231ps_fma(auVar161,local_6a0,local_2a0);
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar169),ZEXT1632(auVar169));
    auVar162._0_4_ = fVar229 * fVar229;
    auVar162._4_4_ = fVar236 * fVar236;
    auVar162._8_4_ = fVar237 * fVar237;
    auVar162._12_4_ = fVar238 * fVar238;
    auVar162._16_4_ = fVar239 * fVar239;
    auVar162._20_4_ = fVar240 * fVar240;
    auVar162._24_4_ = fVar241 * fVar241;
    auVar162._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar162,local_2e0,local_2e0);
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar3),local_2c0,local_2c0);
    auVar88 = vrcpps_avx(ZEXT1632(auVar183));
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = 0x3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar252._16_4_ = 0x3f800000;
    auVar252._20_4_ = 0x3f800000;
    auVar252._24_4_ = 0x3f800000;
    auVar252._28_4_ = 0x3f800000;
    auVar3 = vfnmadd213ps_fma(auVar88,ZEXT1632(auVar183),auVar252);
    auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar88,auVar88);
    local_900 = vpermps_avx2(_DAT_01fb7720,local_9a0);
    local_860 = vpermps_avx2(_DAT_01fb7720,local_9c0);
    auVar24._4_4_ = local_900._4_4_ * fVar236;
    auVar24._0_4_ = local_900._0_4_ * fVar229;
    auVar24._8_4_ = local_900._8_4_ * fVar237;
    auVar24._12_4_ = local_900._12_4_ * fVar238;
    auVar24._16_4_ = local_900._16_4_ * fVar239;
    auVar24._20_4_ = local_900._20_4_ * fVar240;
    auVar24._24_4_ = local_900._24_4_ * fVar241;
    auVar24._28_4_ = auVar88._28_4_;
    auVar82 = vfmsub231ps_fma(auVar24,local_860,local_2c0);
    local_9e0 = vpermps_avx2(_DAT_01fb7720,local_6a0);
    auVar25._4_4_ = fVar249 * local_9e0._4_4_;
    auVar25._0_4_ = fVar248 * local_9e0._0_4_;
    auVar25._8_4_ = fVar260 * local_9e0._8_4_;
    auVar25._12_4_ = fVar261 * local_9e0._12_4_;
    auVar25._16_4_ = fVar262 * local_9e0._16_4_;
    auVar25._20_4_ = fVar263 * local_9e0._20_4_;
    auVar25._24_4_ = fVar264 * local_9e0._24_4_;
    auVar25._28_4_ = 0;
    auVar192 = vfmsub231ps_fma(auVar25,local_900,local_2e0);
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * auVar192._12_4_,
                                                 CONCAT48(auVar192._8_4_ * auVar192._8_4_,
                                                          CONCAT44(auVar192._4_4_ * auVar192._4_4_,
                                                                   auVar192._0_4_ * auVar192._0_4_))
                                                )),ZEXT1632(auVar82),ZEXT1632(auVar82));
    auVar11 = local_860;
    auVar188._0_4_ = fVar272 * local_860._0_4_;
    auVar188._4_4_ = fVar273 * local_860._4_4_;
    auVar188._8_4_ = fVar274 * local_860._8_4_;
    auVar188._12_4_ = fVar275 * local_860._12_4_;
    auVar188._16_4_ = fVar242 * local_860._16_4_;
    auVar188._20_4_ = fVar243 * local_860._20_4_;
    auVar188._24_4_ = fVar247 * local_860._24_4_;
    auVar188._28_4_ = 0;
    auVar192 = vfmsub231ps_fma(auVar188,local_9e0,local_2a0);
    auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar192),ZEXT1632(auVar192));
    auVar88 = vmaxps_avx(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar169._12_4_,
                                            CONCAT48(auVar3._8_4_ * auVar169._8_4_,
                                                     CONCAT44(auVar3._4_4_ * auVar169._4_4_,
                                                              auVar3._0_4_ * auVar169._0_4_)))),
                         ZEXT1632(CONCAT412(auVar82._12_4_ * auVar3._12_4_,
                                            CONCAT48(auVar82._8_4_ * auVar3._8_4_,
                                                     CONCAT44(auVar82._4_4_ * auVar3._4_4_,
                                                              auVar82._0_4_ * auVar3._0_4_)))));
    local_720._0_4_ = auVar180._0_4_ + fVar124;
    local_720._4_4_ = auVar180._4_4_ + fVar138;
    local_720._8_4_ = auVar180._8_4_ + fVar139;
    local_720._12_4_ = auVar180._12_4_ + fVar140;
    local_720._16_4_ = fVar141 + 0.0;
    local_720._20_4_ = fVar142 + 0.0;
    local_720._24_4_ = fVar143 + 0.0;
    local_720._28_4_ = auVar268._28_4_ + 0.0;
    local_700 = ZEXT1632(auVar180);
    auVar268 = vsubps_avx(local_700,auVar21);
    _local_740 = vpermps_avx2(_DAT_01fb7720,auVar268);
    local_760 = vpermps_avx2(_DAT_01fb7720,local_700);
    auVar268 = vmaxps_avx(local_700,local_720);
    auVar9 = vmaxps_avx(_local_740,local_760);
    auVar268 = vmaxps_avx(auVar268,auVar9);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar183));
    fVar124 = auVar9._0_4_;
    fVar138 = auVar9._4_4_;
    fVar143 = auVar9._8_4_;
    fVar139 = auVar9._12_4_;
    fVar140 = auVar9._16_4_;
    fVar141 = auVar9._20_4_;
    fVar142 = auVar9._24_4_;
    auVar219._0_4_ = fVar124 * fVar124 * fVar124 * auVar183._0_4_ * -0.5;
    auVar219._4_4_ = fVar138 * fVar138 * fVar138 * auVar183._4_4_ * -0.5;
    auVar219._8_4_ = fVar143 * fVar143 * fVar143 * auVar183._8_4_ * -0.5;
    auVar219._12_4_ = fVar139 * fVar139 * fVar139 * auVar183._12_4_ * -0.5;
    auVar219._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
    auVar219._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
    auVar219._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
    auVar219._28_4_ = 0;
    auVar163._8_4_ = 0x3fc00000;
    auVar163._0_8_ = 0x3fc000003fc00000;
    auVar163._12_4_ = 0x3fc00000;
    auVar163._16_4_ = 0x3fc00000;
    auVar163._20_4_ = 0x3fc00000;
    auVar163._24_4_ = 0x3fc00000;
    auVar163._28_4_ = 0x3fc00000;
    auVar3 = vfmadd231ps_fma(auVar219,auVar163,auVar9);
    fVar124 = auVar3._0_4_;
    fVar138 = auVar3._4_4_;
    auVar26._4_4_ = fVar273 * fVar138;
    auVar26._0_4_ = fVar272 * fVar124;
    fVar143 = auVar3._8_4_;
    auVar26._8_4_ = fVar274 * fVar143;
    fVar139 = auVar3._12_4_;
    auVar26._12_4_ = fVar275 * fVar139;
    auVar26._16_4_ = fVar242 * 0.0;
    auVar26._20_4_ = fVar243 * 0.0;
    auVar26._24_4_ = fVar247 * 0.0;
    auVar26._28_4_ = auVar9._28_4_;
    auVar27._4_4_ = fStack_59c * fVar138 * fVar236;
    auVar27._0_4_ = local_5a0 * fVar124 * fVar229;
    auVar27._8_4_ = fStack_598 * fVar143 * fVar237;
    auVar27._12_4_ = fStack_594 * fVar139 * fVar238;
    auVar27._16_4_ = fStack_590 * fVar239 * 0.0;
    auVar27._20_4_ = fStack_58c * fVar240 * 0.0;
    auVar27._24_4_ = fStack_588 * fVar241 * 0.0;
    auVar27._28_4_ = local_2e0._28_4_;
    auVar169 = vfmadd231ps_fma(auVar27,auVar26,_local_580);
    local_600 = ZEXT1632(auVar79);
    local_920 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    fVar140 = local_920._0_4_;
    auVar225._0_4_ = fVar140 * fVar124 * fVar229;
    fVar141 = local_920._4_4_;
    auVar225._4_4_ = fVar141 * fVar138 * fVar236;
    fVar142 = local_920._8_4_;
    auVar225._8_4_ = fVar142 * fVar143 * fVar237;
    fVar272 = local_920._12_4_;
    auVar225._12_4_ = fVar272 * fVar139 * fVar238;
    fVar273 = local_920._16_4_;
    auVar225._16_4_ = fVar273 * fVar239 * 0.0;
    fVar274 = local_920._20_4_;
    auVar225._20_4_ = fVar274 * fVar240 * 0.0;
    fVar275 = local_920._24_4_;
    auVar225._24_4_ = fVar275 * fVar241 * 0.0;
    auVar225._28_4_ = 0;
    local_620 = ZEXT1632(auVar191);
    auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_620);
    auVar183 = vfmadd231ps_fma(auVar225,auVar9,auVar26);
    auVar28._4_4_ = fVar249 * fVar138;
    auVar28._0_4_ = fVar248 * fVar124;
    auVar28._8_4_ = fVar260 * fVar143;
    auVar28._12_4_ = fVar261 * fVar139;
    auVar28._16_4_ = fVar262 * 0.0;
    auVar28._20_4_ = fVar263 * 0.0;
    auVar28._24_4_ = fVar264 * 0.0;
    auVar28._28_4_ = local_740._28_4_;
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar28,_local_560);
    auVar203 = ZEXT832(0) << 0x20;
    auVar165 = vsubps_avx(auVar203,auVar160);
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar165,auVar28);
    _local_780 = vsqrtps_avx(auVar88);
    auVar29._4_4_ = fStack_59c * fVar141;
    auVar29._0_4_ = local_5a0 * fVar140;
    auVar29._8_4_ = fStack_598 * fVar142;
    auVar29._12_4_ = fStack_594 * fVar272;
    auVar29._16_4_ = fStack_590 * fVar273;
    auVar29._20_4_ = fStack_58c * fVar274;
    auVar29._24_4_ = fStack_588 * fVar275;
    auVar29._28_4_ = local_740._28_4_;
    auVar82 = vfmadd231ps_fma(auVar29,_local_580,auVar9);
    auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),_local_560,auVar165);
    fVar229 = auVar183._0_4_;
    fVar243 = auVar169._0_4_;
    fVar236 = auVar183._4_4_;
    fVar247 = auVar169._4_4_;
    fVar237 = auVar183._8_4_;
    fVar248 = auVar169._8_4_;
    fVar238 = auVar183._12_4_;
    fVar249 = auVar169._12_4_;
    auVar30._28_4_ = auVar88._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar249 * fVar238,
                            CONCAT48(fVar248 * fVar237,CONCAT44(fVar247 * fVar236,fVar243 * fVar229)
                                    )));
    auVar131 = vsubps_avx(ZEXT1632(auVar82),auVar30);
    auVar31._4_4_ = fVar141 * fVar141;
    auVar31._0_4_ = fVar140 * fVar140;
    auVar31._8_4_ = fVar142 * fVar142;
    auVar31._12_4_ = fVar272 * fVar272;
    auVar31._16_4_ = fVar273 * fVar273;
    auVar31._20_4_ = fVar274 * fVar274;
    auVar31._24_4_ = fVar275 * fVar275;
    auVar31._28_4_ = auVar88._28_4_;
    auVar82 = vfmadd231ps_fma(auVar31,auVar9,auVar9);
    auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar165,auVar165);
    local_820 = vsubps_avx(ZEXT1632(auVar82),
                           ZEXT1632(CONCAT412(fVar238 * fVar238,
                                              CONCAT48(fVar237 * fVar237,
                                                       CONCAT44(fVar236 * fVar236,fVar229 * fVar229)
                                                      ))));
    fVar242 = local_780._28_4_ + auVar268._28_4_;
    fVar229 = (local_780._0_4_ + auVar268._0_4_) * 1.0000002;
    fVar236 = (local_780._4_4_ + auVar268._4_4_) * 1.0000002;
    fVar237 = (local_780._8_4_ + auVar268._8_4_) * 1.0000002;
    fVar238 = (local_780._12_4_ + auVar268._12_4_) * 1.0000002;
    fVar239 = (local_780._16_4_ + auVar268._16_4_) * 1.0000002;
    fVar240 = (local_780._20_4_ + auVar268._20_4_) * 1.0000002;
    fVar241 = (local_780._24_4_ + auVar268._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar236 * fVar236;
    auVar32._0_4_ = fVar229 * fVar229;
    auVar32._8_4_ = fVar237 * fVar237;
    auVar32._12_4_ = fVar238 * fVar238;
    auVar32._16_4_ = fVar239 * fVar239;
    auVar32._20_4_ = fVar240 * fVar240;
    auVar32._24_4_ = fVar241 * fVar241;
    auVar32._28_4_ = fVar242;
    local_940._0_4_ = auVar131._0_4_ + auVar131._0_4_;
    local_940._4_4_ = auVar131._4_4_ + auVar131._4_4_;
    local_940._8_4_ = auVar131._8_4_ + auVar131._8_4_;
    local_940._12_4_ = auVar131._12_4_ + auVar131._12_4_;
    local_940._16_4_ = auVar131._16_4_ + auVar131._16_4_;
    local_940._20_4_ = auVar131._20_4_ + auVar131._20_4_;
    local_940._24_4_ = auVar131._24_4_ + auVar131._24_4_;
    local_940._28_4_ = auVar131._28_4_ + auVar131._28_4_;
    auVar131 = vsubps_avx(local_820,auVar32);
    local_320 = ZEXT1632(auVar169);
    auVar33._28_4_ = fVar242;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar249 * fVar249,
                            CONCAT48(fVar248 * fVar248,CONCAT44(fVar247 * fVar247,fVar243 * fVar243)
                                    )));
    auVar177 = vsubps_avx(local_260,auVar33);
    local_5c0._4_4_ = local_940._4_4_ * local_940._4_4_;
    local_5c0._0_4_ = (float)local_940._0_4_ * (float)local_940._0_4_;
    local_5c0._8_4_ = local_940._8_4_ * local_940._8_4_;
    local_5c0._12_4_ = local_940._12_4_ * local_940._12_4_;
    local_5c0._16_4_ = local_940._16_4_ * local_940._16_4_;
    local_5c0._20_4_ = local_940._20_4_ * local_940._20_4_;
    local_5c0._24_4_ = local_940._24_4_ * local_940._24_4_;
    local_5c0._28_4_ = local_260._28_4_;
    fVar229 = auVar177._0_4_;
    local_5e0._0_4_ = fVar229 * 4.0;
    fVar236 = auVar177._4_4_;
    local_5e0._4_4_ = fVar236 * 4.0;
    fVar237 = auVar177._8_4_;
    fStack_5d8 = fVar237 * 4.0;
    fVar238 = auVar177._12_4_;
    fStack_5d4 = fVar238 * 4.0;
    fVar239 = auVar177._16_4_;
    fStack_5d0 = fVar239 * 4.0;
    fVar240 = auVar177._20_4_;
    fStack_5cc = fVar240 * 4.0;
    fVar241 = auVar177._24_4_;
    fStack_5c8 = fVar241 * 4.0;
    fStack_5c4 = local_780._28_4_;
    auVar34._4_4_ = (float)local_5e0._4_4_ * auVar131._4_4_;
    auVar34._0_4_ = (float)local_5e0._0_4_ * auVar131._0_4_;
    auVar34._8_4_ = fStack_5d8 * auVar131._8_4_;
    auVar34._12_4_ = fStack_5d4 * auVar131._12_4_;
    auVar34._16_4_ = fStack_5d0 * auVar131._16_4_;
    auVar34._20_4_ = fStack_5cc * auVar131._20_4_;
    auVar34._24_4_ = fStack_5c8 * auVar131._24_4_;
    auVar34._28_4_ = 0x40800000;
    auVar90 = vsubps_avx(local_5c0,auVar34);
    auVar268 = vcmpps_avx(auVar90,auVar203,5);
    auVar88 = vandps_avx(auVar33,local_660);
    local_300._0_4_ = fVar229 + fVar229;
    local_300._4_4_ = fVar236 + fVar236;
    local_300._8_4_ = fVar237 + fVar237;
    local_300._12_4_ = fVar238 + fVar238;
    local_300._16_4_ = fVar239 + fVar239;
    local_300._20_4_ = fVar240 + fVar240;
    local_300._24_4_ = fVar241 + fVar241;
    local_300._28_4_ = auVar177._28_4_ + auVar177._28_4_;
    local_400 = vandps_avx(auVar177,local_660);
    local_a40 = ZEXT1632(auVar183);
    if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar268 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar268 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar268 >> 0x7f,0) == '\0') &&
          (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar268 >> 0xbf,0) == '\0') &&
        (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar268[0x1f])
    {
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar253._8_4_ = 0xff800000;
      auVar253._0_8_ = 0xff800000ff800000;
      auVar253._12_4_ = 0xff800000;
      auVar253._16_4_ = 0xff800000;
      auVar253._20_4_ = 0xff800000;
      auVar253._24_4_ = 0xff800000;
      auVar253._28_4_ = 0xff800000;
    }
    else {
      auVar130 = vsqrtps_avx(auVar90);
      auVar111 = vrcpps_avx(local_300);
      auVar177 = vcmpps_avx(auVar90,auVar203,5);
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar169 = vfnmadd213ps_fma(auVar111,local_300,auVar204);
      auVar169 = vfmadd132ps_fma(ZEXT1632(auVar169),auVar111,auVar111);
      uVar13 = CONCAT44(local_940._4_4_,local_940._0_4_);
      auVar256._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar256._8_4_ = -local_940._8_4_;
      auVar256._12_4_ = -local_940._12_4_;
      auVar256._16_4_ = -local_940._16_4_;
      auVar256._20_4_ = -local_940._20_4_;
      auVar256._24_4_ = -local_940._24_4_;
      auVar256._28_4_ = -local_940._28_4_;
      auVar90 = vsubps_avx(auVar256,auVar130);
      auVar35._4_4_ = auVar90._4_4_ * auVar169._4_4_;
      auVar35._0_4_ = auVar90._0_4_ * auVar169._0_4_;
      auVar35._8_4_ = auVar90._8_4_ * auVar169._8_4_;
      auVar35._12_4_ = auVar90._12_4_ * auVar169._12_4_;
      auVar35._16_4_ = auVar90._16_4_ * 0.0;
      auVar35._20_4_ = auVar90._20_4_ * 0.0;
      auVar35._24_4_ = auVar90._24_4_ * 0.0;
      auVar35._28_4_ = auVar90._28_4_;
      auVar90 = vsubps_avx(auVar130,local_940);
      auVar36._4_4_ = auVar169._4_4_ * auVar90._4_4_;
      auVar36._0_4_ = auVar169._0_4_ * auVar90._0_4_;
      auVar36._8_4_ = auVar169._8_4_ * auVar90._8_4_;
      auVar36._12_4_ = auVar169._12_4_ * auVar90._12_4_;
      auVar36._16_4_ = auVar90._16_4_ * 0.0;
      auVar36._20_4_ = auVar90._20_4_ * 0.0;
      auVar36._24_4_ = auVar90._24_4_ * 0.0;
      auVar36._28_4_ = auVar90._28_4_;
      auVar169 = vfmadd213ps_fma(local_320,auVar35,local_a40);
      local_3e0 = fVar124 * auVar169._0_4_;
      fStack_3dc = fVar138 * auVar169._4_4_;
      fStack_3d8 = fVar143 * auVar169._8_4_;
      fStack_3d4 = fVar139 * auVar169._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x80000000;
      auVar169 = vfmadd213ps_fma(local_320,auVar36,local_a40);
      local_3c0 = fVar124 * auVar169._0_4_;
      fStack_3bc = fVar138 * auVar169._4_4_;
      fStack_3b8 = fVar143 * auVar169._8_4_;
      fStack_3b4 = fVar139 * auVar169._12_4_;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 0x80000000;
      auVar205._8_4_ = 0x7f800000;
      auVar205._0_8_ = 0x7f8000007f800000;
      auVar205._12_4_ = 0x7f800000;
      auVar205._16_4_ = 0x7f800000;
      auVar205._20_4_ = 0x7f800000;
      auVar205._24_4_ = 0x7f800000;
      auVar205._28_4_ = 0x7f800000;
      auVar220 = vblendvps_avx(auVar205,auVar35,auVar177);
      auVar206._8_4_ = 0xff800000;
      auVar206._0_8_ = 0xff800000ff800000;
      auVar206._12_4_ = 0xff800000;
      auVar206._16_4_ = 0xff800000;
      auVar206._20_4_ = 0xff800000;
      auVar206._24_4_ = 0xff800000;
      auVar206._28_4_ = 0xff800000;
      auVar253 = vblendvps_avx(auVar206,auVar36,auVar177);
      auVar90 = vmaxps_avx(local_4a0,auVar88);
      auVar37._4_4_ = auVar90._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar90._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar90._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar90._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar90._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar90._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar90._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar90._28_4_;
      auVar90 = vcmpps_avx(local_400,auVar37,1);
      auVar203 = auVar177 & auVar90;
      if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar203 >> 0x7f,0) != '\0') ||
            (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar203 >> 0xbf,0) != '\0') ||
          (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar203[0x1f] < '\0') {
        auVar268 = vandps_avx(auVar90,auVar177);
        auVar90 = vcmpps_avx(auVar131,_DAT_01f7b000,2);
        auVar210._8_4_ = 0xff800000;
        auVar210._0_8_ = 0xff800000ff800000;
        auVar210._12_4_ = 0xff800000;
        auVar210._16_4_ = 0xff800000;
        auVar210._20_4_ = 0xff800000;
        auVar210._24_4_ = 0xff800000;
        auVar210._28_4_ = 0xff800000;
        auVar269._8_4_ = 0x7f800000;
        auVar269._0_8_ = 0x7f8000007f800000;
        auVar269._12_4_ = 0x7f800000;
        auVar269._16_4_ = 0x7f800000;
        auVar269._20_4_ = 0x7f800000;
        auVar269._24_4_ = 0x7f800000;
        auVar269._28_4_ = 0x7f800000;
        auVar131 = vblendvps_avx(auVar269,auVar210,auVar90);
        auVar169 = vpackssdw_avx(auVar268._0_16_,auVar268._16_16_);
        auVar203 = vpmovsxwd_avx2(auVar169);
        auVar220 = vblendvps_avx(auVar220,auVar131,auVar203);
        auVar131 = vblendvps_avx(auVar210,auVar269,auVar90);
        auVar253 = vblendvps_avx(auVar253,auVar131,auVar203);
        auVar198._0_8_ = auVar268._0_8_ ^ 0xffffffffffffffff;
        auVar198._8_4_ = auVar268._8_4_ ^ 0xffffffff;
        auVar198._12_4_ = auVar268._12_4_ ^ 0xffffffff;
        auVar198._16_4_ = auVar268._16_4_ ^ 0xffffffff;
        auVar198._20_4_ = auVar268._20_4_ ^ 0xffffffff;
        auVar198._24_4_ = auVar268._24_4_ ^ 0xffffffff;
        auVar198._28_4_ = auVar268._28_4_ ^ 0xffffffff;
        auVar268 = vorps_avx(auVar90,auVar198);
        auVar268 = vandps_avx(auVar177,auVar268);
      }
    }
    auVar234 = ZEXT3264(local_a00);
    auVar131 = local_340 & auVar268;
    auVar259 = ZEXT3264(local_7e0);
    auVar214 = local_880;
    fVar229 = (float)local_800._0_4_;
    fVar236 = (float)local_800._4_4_;
    fVar237 = fStack_7f8;
    fVar238 = fStack_7f4;
    fVar239 = fStack_7f0;
    fVar240 = fStack_7ec;
    fVar241 = fStack_7e8;
    fVar242 = fStack_7e4;
    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar131 >> 0x7f,0) == '\0') &&
          (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar131 >> 0xbf,0) == '\0') &&
        (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar131[0x1f])
    {
      auVar254 = ZEXT3264(local_8a0);
      auVar211 = ZEXT3264(local_8c0);
      auVar223 = ZEXT3264(local_8e0);
      auVar228 = ZEXT3264(local_a00);
    }
    else {
      local_420 = ZEXT1632(auVar3);
      fVar243 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7a0._0_4_;
      auVar189._4_4_ = fVar243;
      auVar189._0_4_ = fVar243;
      auVar189._8_4_ = fVar243;
      auVar189._12_4_ = fVar243;
      auVar189._16_4_ = fVar243;
      auVar189._20_4_ = fVar243;
      auVar189._24_4_ = fVar243;
      auVar189._28_4_ = fVar243;
      auVar131 = vmaxps_avx(auVar189,auVar220);
      fVar243 = (ray->super_RayK<1>).tfar - (float)local_7a0._0_4_;
      auVar195._4_4_ = fVar243;
      auVar195._0_4_ = fVar243;
      auVar195._8_4_ = fVar243;
      auVar195._12_4_ = fVar243;
      auVar195._16_4_ = fVar243;
      auVar195._20_4_ = fVar243;
      auVar195._24_4_ = fVar243;
      auVar195._28_4_ = fVar243;
      auVar177 = vminps_avx(auVar195,auVar253);
      auVar64._4_4_ = fVar118 * fVar141;
      auVar64._0_4_ = fVar98 * fVar140;
      auVar64._8_4_ = fVar119 * fVar142;
      auVar64._12_4_ = fVar120 * fVar272;
      auVar64._16_4_ = fVar121 * fVar273;
      auVar64._20_4_ = fVar122 * fVar274;
      auVar64._24_4_ = fVar123 * fVar275;
      auVar64._28_4_ = local_940._28_4_;
      auVar3 = vfmadd213ps_fma(auVar9,local_6a0,auVar64);
      auVar169 = vfmadd213ps_fma(auVar165,local_9a0,ZEXT1632(auVar3));
      auVar38._4_4_ = fStack_59c * fVar118;
      auVar38._0_4_ = local_5a0 * fVar98;
      auVar38._8_4_ = fStack_598 * fVar119;
      auVar38._12_4_ = fStack_594 * fVar120;
      auVar38._16_4_ = fStack_590 * fVar121;
      auVar38._20_4_ = fStack_58c * fVar122;
      auVar38._24_4_ = fStack_588 * fVar123;
      auVar38._28_4_ = auVar10._28_4_;
      auVar3 = vfmadd231ps_fma(auVar38,_local_580,local_6a0);
      auVar183 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_560,local_9a0);
      auVar9 = vandps_avx(local_660,ZEXT1632(auVar183));
      auVar257._8_4_ = 0x219392ef;
      auVar257._0_8_ = 0x219392ef219392ef;
      auVar257._12_4_ = 0x219392ef;
      auVar257._16_4_ = 0x219392ef;
      auVar257._20_4_ = 0x219392ef;
      auVar257._24_4_ = 0x219392ef;
      auVar257._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar257,1);
      auVar9 = vrcpps_avx(ZEXT1632(auVar183));
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar230._16_4_ = 0x3f800000;
      auVar230._20_4_ = 0x3f800000;
      auVar230._24_4_ = 0x3f800000;
      auVar230._28_4_ = 0x3f800000;
      auVar90 = ZEXT1632(auVar183);
      auVar3 = vfnmadd213ps_fma(auVar9,auVar90,auVar230);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar9,auVar9);
      auVar231._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
      auVar231._8_4_ = auVar183._8_4_ ^ 0x80000000;
      auVar231._12_4_ = auVar183._12_4_ ^ 0x80000000;
      auVar231._16_4_ = 0x80000000;
      auVar231._20_4_ = 0x80000000;
      auVar231._24_4_ = 0x80000000;
      auVar231._28_4_ = 0x80000000;
      auVar39._4_4_ = auVar3._4_4_ * -auVar169._4_4_;
      auVar39._0_4_ = auVar3._0_4_ * -auVar169._0_4_;
      auVar39._8_4_ = auVar3._8_4_ * -auVar169._8_4_;
      auVar39._12_4_ = auVar3._12_4_ * -auVar169._12_4_;
      auVar39._16_4_ = 0x80000000;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar9 = vcmpps_avx(auVar90,auVar231,1);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar258._8_4_ = 0xff800000;
      auVar258._0_8_ = 0xff800000ff800000;
      auVar258._12_4_ = 0xff800000;
      auVar258._16_4_ = 0xff800000;
      auVar258._20_4_ = 0xff800000;
      auVar258._24_4_ = 0xff800000;
      auVar258._28_4_ = 0xff800000;
      auVar9 = vblendvps_avx(auVar39,auVar258,auVar9);
      auVar165 = vmaxps_avx(auVar131,auVar9);
      auVar9 = vcmpps_avx(auVar90,auVar231,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar232._8_4_ = 0x7f800000;
      auVar232._0_8_ = 0x7f8000007f800000;
      auVar232._12_4_ = 0x7f800000;
      auVar232._16_4_ = 0x7f800000;
      auVar232._20_4_ = 0x7f800000;
      auVar232._24_4_ = 0x7f800000;
      auVar232._28_4_ = 0x7f800000;
      auVar234 = ZEXT3264(auVar232);
      auVar9 = vblendvps_avx(auVar39,auVar232,auVar9);
      auVar131 = vminps_avx(auVar177,auVar9);
      fVar98 = -local_860._0_4_;
      fVar118 = -local_860._4_4_;
      fVar119 = -local_860._8_4_;
      fVar120 = -local_860._12_4_;
      fVar121 = -local_860._16_4_;
      fVar122 = -local_860._20_4_;
      fVar123 = -local_860._24_4_;
      auVar164._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
      auVar164._8_4_ = -local_9e0._8_4_;
      auVar164._12_4_ = -local_9e0._12_4_;
      auVar164._16_4_ = -local_9e0._16_4_;
      auVar164._20_4_ = -local_9e0._20_4_;
      auVar164._24_4_ = -local_9e0._24_4_;
      auVar164._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_840);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,_local_7c0);
      auVar40._4_4_ = auVar10._4_4_ * fVar118;
      auVar40._0_4_ = auVar10._0_4_ * fVar98;
      auVar40._8_4_ = auVar10._8_4_ * fVar119;
      auVar40._12_4_ = auVar10._12_4_ * fVar120;
      auVar40._16_4_ = auVar10._16_4_ * fVar121;
      auVar40._20_4_ = auVar10._20_4_ * fVar122;
      auVar40._24_4_ = auVar10._24_4_ * fVar123;
      auVar40._28_4_ = auVar10._28_4_;
      auVar3 = vfmadd231ps_fma(auVar40,auVar164,auVar9);
      auVar175._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
      auVar175._8_4_ = -local_900._8_4_;
      auVar175._12_4_ = -local_900._12_4_;
      auVar175._16_4_ = -local_900._16_4_;
      auVar175._20_4_ = -local_900._20_4_;
      auVar175._24_4_ = -local_900._24_4_;
      auVar175._28_4_ = local_900._28_4_ ^ 0x80000000;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_a20);
      auVar169 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar175,auVar9);
      auVar41._4_4_ = fStack_59c * fVar118;
      auVar41._0_4_ = local_5a0 * fVar98;
      auVar41._8_4_ = fStack_598 * fVar119;
      auVar41._12_4_ = fStack_594 * fVar120;
      auVar41._16_4_ = fStack_590 * fVar121;
      auVar41._20_4_ = fStack_58c * fVar122;
      auVar41._24_4_ = fStack_588 * fVar123;
      auVar41._28_4_ = local_860._28_4_ ^ 0x80000000;
      auVar3 = vfmadd231ps_fma(auVar41,_local_580,auVar164);
      auVar183 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_560,auVar175);
      auVar9 = vandps_avx(local_660,ZEXT1632(auVar183));
      auVar177 = vrcpps_avx(ZEXT1632(auVar183));
      auVar196._8_4_ = 0x219392ef;
      auVar196._0_8_ = 0x219392ef219392ef;
      auVar196._12_4_ = 0x219392ef;
      auVar196._16_4_ = 0x219392ef;
      auVar196._20_4_ = 0x219392ef;
      auVar196._24_4_ = 0x219392ef;
      auVar196._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar196,1);
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = 0x3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar221._16_4_ = 0x3f800000;
      auVar221._20_4_ = 0x3f800000;
      auVar221._24_4_ = 0x3f800000;
      auVar221._28_4_ = 0x3f800000;
      auVar90 = ZEXT1632(auVar183);
      auVar3 = vfnmadd213ps_fma(auVar177,auVar90,auVar221);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar177,auVar177);
      auVar176._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
      auVar176._8_4_ = auVar183._8_4_ ^ 0x80000000;
      auVar176._12_4_ = auVar183._12_4_ ^ 0x80000000;
      auVar176._16_4_ = 0x80000000;
      auVar176._20_4_ = 0x80000000;
      auVar176._24_4_ = 0x80000000;
      auVar176._28_4_ = 0x80000000;
      auVar42._4_4_ = auVar3._4_4_ * -auVar169._4_4_;
      auVar42._0_4_ = auVar3._0_4_ * -auVar169._0_4_;
      auVar42._8_4_ = auVar3._8_4_ * -auVar169._8_4_;
      auVar42._12_4_ = auVar3._12_4_ * -auVar169._12_4_;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar9 = vcmpps_avx(auVar90,auVar176,1);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar9 = vblendvps_avx(auVar42,auVar258,auVar9);
      local_680 = vmaxps_avx(auVar165,auVar9);
      auVar9 = vcmpps_avx(auVar90,auVar176,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar9 = vblendvps_avx(auVar42,auVar232,auVar9);
      auVar268 = vandps_avx(auVar268,local_340);
      local_500 = vminps_avx(auVar131,auVar9);
      auVar9 = vcmpps_avx(local_680,local_500,2);
      auVar10 = auVar268 & auVar9;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        local_840._8_4_ = 0x80000000;
        local_840._0_8_ = 0x8000000080000000;
        local_840._12_4_ = 0x80000000;
        local_840._16_4_ = 0x80000000;
        local_840._20_4_ = 0x80000000;
        local_840._24_4_ = 0x80000000;
        local_840._28_4_ = 0x80000000;
        auVar59._4_4_ = fStack_3dc;
        auVar59._0_4_ = local_3e0;
        auVar59._8_4_ = fStack_3d8;
        auVar59._12_4_ = fStack_3d4;
        auVar59._16_4_ = uStack_3d0;
        auVar59._20_4_ = uStack_3cc;
        auVar59._24_4_ = uStack_3c8;
        auVar59._28_4_ = uStack_3c4;
        auVar197._8_4_ = 0x3f800000;
        auVar197._0_8_ = 0x3f8000003f800000;
        auVar197._12_4_ = 0x3f800000;
        auVar197._16_4_ = 0x3f800000;
        auVar197._20_4_ = 0x3f800000;
        auVar197._24_4_ = 0x3f800000;
        auVar197._28_4_ = 0x3f800000;
        auVar10 = vminps_avx(auVar59,auVar197);
        auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar10 = vmaxps_avx(auVar10,ZEXT832(0) << 0x20);
        auVar60._4_4_ = fStack_3bc;
        auVar60._0_4_ = local_3c0;
        auVar60._8_4_ = fStack_3b8;
        auVar60._12_4_ = fStack_3b4;
        auVar60._16_4_ = uStack_3b0;
        auVar60._20_4_ = uStack_3ac;
        auVar60._24_4_ = uStack_3a8;
        auVar60._28_4_ = uStack_3a4;
        auVar165 = vminps_avx(auVar60,auVar197);
        auVar165 = vmaxps_avx(auVar165,ZEXT832(0) << 0x20);
        auVar43._4_4_ = (auVar10._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar10._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar10._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar10._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar10._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar10._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar10._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar10._28_4_ + 7.0;
        auVar3 = vfmadd213ps_fma(auVar43,local_6e0,local_6c0);
        auVar44._4_4_ = (auVar165._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar165._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar165._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar165._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar165._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar165._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar165._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar165._28_4_ + 7.0;
        auVar169 = vfmadd213ps_fma(auVar44,local_6e0,local_6c0);
        auVar10 = vminps_avx(local_700,local_720);
        auVar165 = vminps_avx(_local_740,local_760);
        auVar10 = vminps_avx(auVar10,auVar165);
        auVar10 = vsubps_avx(auVar10,_local_780);
        auVar268 = vandps_avx(auVar9,auVar268);
        local_1a0 = ZEXT1632(auVar3);
        local_1c0 = ZEXT1632(auVar169);
        auVar45._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar45._28_4_ = 0x3f7ffffc;
        auVar9 = vmaxps_avx(ZEXT832(0) << 0x20,auVar45);
        auVar46._4_4_ = auVar9._4_4_ * auVar9._4_4_;
        auVar46._0_4_ = auVar9._0_4_ * auVar9._0_4_;
        auVar46._8_4_ = auVar9._8_4_ * auVar9._8_4_;
        auVar46._12_4_ = auVar9._12_4_ * auVar9._12_4_;
        auVar46._16_4_ = auVar9._16_4_ * auVar9._16_4_;
        auVar46._20_4_ = auVar9._20_4_ * auVar9._20_4_;
        auVar46._24_4_ = auVar9._24_4_ * auVar9._24_4_;
        auVar46._28_4_ = auVar9._28_4_;
        auVar10 = vsubps_avx(local_820,auVar46);
        auVar47._4_4_ = auVar10._4_4_ * (float)local_5e0._4_4_;
        auVar47._0_4_ = auVar10._0_4_ * (float)local_5e0._0_4_;
        auVar47._8_4_ = auVar10._8_4_ * fStack_5d8;
        auVar47._12_4_ = auVar10._12_4_ * fStack_5d4;
        auVar47._16_4_ = auVar10._16_4_ * fStack_5d0;
        auVar47._20_4_ = auVar10._20_4_ * fStack_5cc;
        auVar47._24_4_ = auVar10._24_4_ * fStack_5c8;
        auVar47._28_4_ = auVar9._28_4_;
        auVar9 = vsubps_avx(local_5c0,auVar47);
        local_a20 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,5);
        if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a20 >> 0x7f,0) == '\0') &&
              (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a20 >> 0xbf,0) == '\0') &&
            (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a20[0x1f]) {
          auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar187 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar177 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_b20 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar207._8_4_ = 0x7f800000;
          auVar207._0_8_ = 0x7f8000007f800000;
          auVar207._12_4_ = 0x7f800000;
          auVar207._16_4_ = 0x7f800000;
          auVar207._20_4_ = 0x7f800000;
          auVar207._24_4_ = 0x7f800000;
          auVar207._28_4_ = 0x7f800000;
          auVar226._8_4_ = 0xff800000;
          auVar226._0_8_ = 0xff800000ff800000;
          auVar226._12_4_ = 0xff800000;
          auVar226._16_4_ = 0xff800000;
          auVar226._20_4_ = 0xff800000;
          auVar226._24_4_ = 0xff800000;
          auVar226._28_4_ = 0xff800000;
        }
        else {
          auVar131 = vrcpps_avx(local_300);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar166._16_4_ = 0x3f800000;
          auVar166._20_4_ = 0x3f800000;
          auVar166._24_4_ = 0x3f800000;
          auVar166._28_4_ = 0x3f800000;
          auVar3 = vfnmadd213ps_fma(local_300,auVar131,auVar166);
          auVar177 = vsqrtps_avx(auVar9);
          auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar131,auVar131);
          uVar13 = CONCAT44(local_940._4_4_,local_940._0_4_);
          auVar132._0_8_ = uVar13 ^ 0x8000000080000000;
          auVar132._8_4_ = -local_940._8_4_;
          auVar132._12_4_ = -local_940._12_4_;
          auVar132._16_4_ = -local_940._16_4_;
          auVar132._20_4_ = -local_940._20_4_;
          auVar132._24_4_ = -local_940._24_4_;
          auVar132._28_4_ = -local_940._28_4_;
          auVar131 = vsubps_avx(auVar132,auVar177);
          auVar177 = vsubps_avx(auVar177,local_940);
          fVar140 = auVar131._0_4_ * auVar3._0_4_;
          fVar141 = auVar131._4_4_ * auVar3._4_4_;
          auVar48._4_4_ = fVar141;
          auVar48._0_4_ = fVar140;
          fVar142 = auVar131._8_4_ * auVar3._8_4_;
          auVar48._8_4_ = fVar142;
          fVar272 = auVar131._12_4_ * auVar3._12_4_;
          auVar48._12_4_ = fVar272;
          fVar273 = auVar131._16_4_ * 0.0;
          auVar48._16_4_ = fVar273;
          fVar274 = auVar131._20_4_ * 0.0;
          auVar48._20_4_ = fVar274;
          fVar275 = auVar131._24_4_ * 0.0;
          auVar48._24_4_ = fVar275;
          auVar48._28_4_ = fVar271;
          fVar98 = auVar177._0_4_ * auVar3._0_4_;
          fVar118 = auVar177._4_4_ * auVar3._4_4_;
          auVar49._4_4_ = fVar118;
          auVar49._0_4_ = fVar98;
          fVar119 = auVar177._8_4_ * auVar3._8_4_;
          auVar49._8_4_ = fVar119;
          fVar120 = auVar177._12_4_ * auVar3._12_4_;
          auVar49._12_4_ = fVar120;
          fVar121 = auVar177._16_4_ * 0.0;
          auVar49._16_4_ = fVar121;
          fVar122 = auVar177._20_4_ * 0.0;
          auVar49._20_4_ = fVar122;
          fVar123 = auVar177._24_4_ * 0.0;
          auVar49._24_4_ = fVar123;
          auVar49._28_4_ = auVar165._28_4_;
          auVar3 = vfmadd213ps_fma(local_320,auVar48,local_a40);
          auVar169 = vfmadd213ps_fma(local_320,auVar49,local_a40);
          auVar165 = ZEXT1632(CONCAT412(fVar139 * auVar3._12_4_,
                                        CONCAT48(fVar143 * auVar3._8_4_,
                                                 CONCAT44(fVar138 * auVar3._4_4_,
                                                          fVar124 * auVar3._0_4_))));
          auVar131 = ZEXT1632(CONCAT412(fVar139 * auVar169._12_4_,
                                        CONCAT48(fVar143 * auVar169._8_4_,
                                                 CONCAT44(fVar138 * auVar169._4_4_,
                                                          fVar124 * auVar169._0_4_))));
          auVar3 = vfmadd213ps_fma(local_2c0,auVar165,auVar160);
          auVar169 = vfmadd213ps_fma(local_2c0,auVar131,auVar160);
          auVar183 = vfmadd213ps_fma(local_2e0,auVar165,local_620);
          auVar82 = vfmadd213ps_fma(local_2e0,auVar131,local_620);
          auVar192 = vfmadd213ps_fma(auVar165,local_2a0,local_600);
          auVar217 = vfmadd213ps_fma(local_2a0,auVar131,local_600);
          auVar50._4_4_ = fVar141 * (float)local_560._4_4_;
          auVar50._0_4_ = fVar140 * (float)local_560._0_4_;
          auVar50._8_4_ = fVar142 * fStack_558;
          auVar50._12_4_ = fVar272 * fStack_554;
          auVar50._16_4_ = fVar273 * fStack_550;
          auVar50._20_4_ = fVar274 * fStack_54c;
          auVar50._24_4_ = fVar275 * fStack_548;
          auVar50._28_4_ = 0;
          auVar165 = vsubps_avx(auVar50,ZEXT1632(auVar3));
          auVar178._0_4_ = fVar140 * (float)local_580._0_4_;
          auVar178._4_4_ = fVar141 * (float)local_580._4_4_;
          auVar178._8_4_ = fVar142 * fStack_578;
          auVar178._12_4_ = fVar272 * fStack_574;
          auVar178._16_4_ = fVar273 * fStack_570;
          auVar178._20_4_ = fVar274 * fStack_56c;
          auVar178._24_4_ = fVar275 * fStack_568;
          auVar178._28_4_ = 0;
          auVar177 = vsubps_avx(auVar178,ZEXT1632(auVar183));
          auVar190._0_4_ = local_5a0 * fVar140;
          auVar190._4_4_ = fStack_59c * fVar141;
          auVar190._8_4_ = fStack_598 * fVar142;
          auVar190._12_4_ = fStack_594 * fVar272;
          auVar190._16_4_ = fStack_590 * fVar273;
          auVar190._20_4_ = fStack_58c * fVar274;
          auVar190._24_4_ = fStack_588 * fVar275;
          auVar190._28_4_ = 0;
          auVar131 = vsubps_avx(auVar190,ZEXT1632(auVar192));
          _local_b20 = auVar131._0_28_;
          auVar51._4_4_ = fVar118 * (float)local_560._4_4_;
          auVar51._0_4_ = fVar98 * (float)local_560._0_4_;
          auVar51._8_4_ = fVar119 * fStack_558;
          auVar51._12_4_ = fVar120 * fStack_554;
          auVar51._16_4_ = fVar121 * fStack_550;
          auVar51._20_4_ = fVar122 * fStack_54c;
          auVar51._24_4_ = fVar123 * fStack_548;
          auVar51._28_4_ = auVar131._28_4_;
          auVar131 = vsubps_avx(auVar51,ZEXT1632(auVar169));
          auVar52._4_4_ = fVar118 * (float)local_580._4_4_;
          auVar52._0_4_ = fVar98 * (float)local_580._0_4_;
          auVar52._8_4_ = fVar119 * fStack_578;
          auVar52._12_4_ = fVar120 * fStack_574;
          auVar52._16_4_ = fVar121 * fStack_570;
          auVar52._20_4_ = fVar122 * fStack_56c;
          auVar52._24_4_ = fVar123 * fStack_568;
          auVar52._28_4_ = 0;
          auVar90 = vsubps_avx(auVar52,ZEXT1632(auVar82));
          auVar53._4_4_ = fStack_59c * fVar118;
          auVar53._0_4_ = local_5a0 * fVar98;
          auVar53._8_4_ = fStack_598 * fVar119;
          auVar53._12_4_ = fStack_594 * fVar120;
          auVar53._16_4_ = fStack_590 * fVar121;
          auVar53._20_4_ = fStack_58c * fVar122;
          auVar53._24_4_ = fStack_588 * fVar123;
          auVar53._28_4_ = 0;
          auVar160 = vsubps_avx(auVar53,ZEXT1632(auVar217));
          auVar187 = auVar160._0_28_;
          auVar9 = vcmpps_avx(auVar9,_DAT_01f7b000,5);
          auVar208._8_4_ = 0x7f800000;
          auVar208._0_8_ = 0x7f8000007f800000;
          auVar208._12_4_ = 0x7f800000;
          auVar208._16_4_ = 0x7f800000;
          auVar208._20_4_ = 0x7f800000;
          auVar208._24_4_ = 0x7f800000;
          auVar208._28_4_ = 0x7f800000;
          auVar207 = vblendvps_avx(auVar208,auVar48,auVar9);
          auVar88 = vmaxps_avx(local_4a0,auVar88);
          auVar54._4_4_ = auVar88._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar88._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar88._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar88._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar88._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar88._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar88._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar88._28_4_;
          auVar88 = vcmpps_avx(local_400,auVar54,1);
          auVar227._8_4_ = 0xff800000;
          auVar227._0_8_ = 0xff800000ff800000;
          auVar227._12_4_ = 0xff800000;
          auVar227._16_4_ = 0xff800000;
          auVar227._20_4_ = 0xff800000;
          auVar227._24_4_ = 0xff800000;
          auVar227._28_4_ = 0xff800000;
          auVar226 = vblendvps_avx(auVar227,auVar49,auVar9);
          auVar160 = auVar9 & auVar88;
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            auVar88 = vandps_avx(auVar88,auVar9);
            auVar160 = vcmpps_avx(auVar10,_DAT_01f7b000,2);
            auVar222._8_4_ = 0xff800000;
            auVar222._0_8_ = 0xff800000ff800000;
            auVar222._12_4_ = 0xff800000;
            auVar222._16_4_ = 0xff800000;
            auVar222._20_4_ = 0xff800000;
            auVar222._24_4_ = 0xff800000;
            auVar222._28_4_ = 0xff800000;
            auVar270._8_4_ = 0x7f800000;
            auVar270._0_8_ = 0x7f8000007f800000;
            auVar270._12_4_ = 0x7f800000;
            auVar270._16_4_ = 0x7f800000;
            auVar270._20_4_ = 0x7f800000;
            auVar270._24_4_ = 0x7f800000;
            auVar270._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar270,auVar222,auVar160);
            auVar3 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar203 = vpmovsxwd_avx2(auVar3);
            auVar207 = vblendvps_avx(auVar207,auVar10,auVar203);
            auVar10 = vblendvps_avx(auVar222,auVar270,auVar160);
            auVar226 = vblendvps_avx(auVar226,auVar10,auVar203);
            auVar216._0_8_ = auVar88._0_8_ ^ 0xffffffffffffffff;
            auVar216._8_4_ = auVar88._8_4_ ^ 0xffffffff;
            auVar216._12_4_ = auVar88._12_4_ ^ 0xffffffff;
            auVar216._16_4_ = auVar88._16_4_ ^ 0xffffffff;
            auVar216._20_4_ = auVar88._20_4_ ^ 0xffffffff;
            auVar216._24_4_ = auVar88._24_4_ ^ 0xffffffff;
            auVar216._28_4_ = auVar88._28_4_ ^ 0xffffffff;
            auVar88 = vorps_avx(auVar160,auVar216);
            local_a20 = vandps_avx(auVar9,auVar88);
          }
        }
        uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar233._4_4_ = uVar76;
        auVar233._0_4_ = uVar76;
        auVar233._8_4_ = uVar76;
        auVar233._12_4_ = uVar76;
        auVar233._16_4_ = uVar76;
        auVar233._20_4_ = uVar76;
        auVar233._24_4_ = uVar76;
        auVar233._28_4_ = uVar76;
        auVar234 = ZEXT3264(auVar233);
        uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar246._4_4_ = uVar76;
        auVar246._0_4_ = uVar76;
        auVar246._8_4_ = uVar76;
        auVar246._12_4_ = uVar76;
        auVar246._16_4_ = uVar76;
        auVar246._20_4_ = uVar76;
        auVar246._24_4_ = uVar76;
        auVar246._28_4_ = uVar76;
        fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_4e0 = local_680;
        local_4c0 = vminps_avx(local_500,auVar207);
        _local_520 = vmaxps_avx(local_680,auVar226);
        auVar88 = vcmpps_avx(local_680,local_4c0,2);
        local_5c0 = vandps_avx(auVar88,auVar268);
        auVar88 = vcmpps_avx(_local_520,local_500,2);
        local_760 = vandps_avx(auVar88,auVar268);
        auVar88 = vorps_avx(local_760,local_5c0);
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0x7f,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0xbf,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar88[0x1f] < '\0') {
          _local_740 = _local_520;
          local_820._0_4_ = uVar73;
          auVar55._4_4_ = fVar124 * auVar187._4_4_;
          auVar55._0_4_ = fVar124 * auVar187._0_4_;
          auVar55._8_4_ = fVar124 * auVar187._8_4_;
          auVar55._12_4_ = fVar124 * auVar187._12_4_;
          auVar55._16_4_ = fVar124 * auVar187._16_4_;
          auVar55._20_4_ = fVar124 * auVar187._20_4_;
          auVar55._24_4_ = fVar124 * auVar187._24_4_;
          auVar55._28_4_ = auVar88._28_4_;
          auVar3 = vfmadd213ps_fma(auVar90,auVar246,auVar55);
          auVar56._4_4_ = fVar124 * (float)local_b20._4_4_;
          auVar56._0_4_ = fVar124 * (float)local_b20._0_4_;
          auVar56._8_4_ = fVar124 * fStack_b18;
          auVar56._12_4_ = fVar124 * fStack_b14;
          auVar56._16_4_ = fVar124 * fStack_b10;
          auVar56._20_4_ = fVar124 * fStack_b0c;
          auVar56._24_4_ = fVar124 * fStack_b08;
          auVar56._28_4_ = auVar88._28_4_;
          auVar169 = vfmadd213ps_fma(auVar177,auVar246,auVar56);
          auVar3 = vfmadd213ps_fma(auVar131,auVar233,ZEXT1632(auVar3));
          auVar93._0_8_ = local_a20._0_8_ ^ 0xffffffffffffffff;
          auVar93._8_4_ = local_a20._8_4_ ^ 0xffffffff;
          auVar93._12_4_ = local_a20._12_4_ ^ 0xffffffff;
          auVar93._16_4_ = local_a20._16_4_ ^ 0xffffffff;
          auVar93._20_4_ = local_a20._20_4_ ^ 0xffffffff;
          auVar93._24_4_ = local_a20._24_4_ ^ 0xffffffff;
          auVar93._28_4_ = local_a20._28_4_ ^ 0xffffffff;
          auVar88 = vandps_avx(ZEXT1632(auVar3),local_660);
          auVar133._8_4_ = 0x3e99999a;
          auVar133._0_8_ = 0x3e99999a3e99999a;
          auVar133._12_4_ = 0x3e99999a;
          auVar133._16_4_ = 0x3e99999a;
          auVar133._20_4_ = 0x3e99999a;
          auVar133._24_4_ = 0x3e99999a;
          auVar133._28_4_ = 0x3e99999a;
          auVar88 = vcmpps_avx(auVar88,auVar133,1);
          local_600 = vorps_avx(auVar88,auVar93);
          auVar3 = vfmadd213ps_fma(auVar165,auVar233,ZEXT1632(auVar169));
          auVar88 = vandps_avx(ZEXT1632(auVar3),local_660);
          auVar88 = vcmpps_avx(auVar88,auVar133,1);
          auVar88 = vorps_avx(auVar88,auVar93);
          auVar115._8_4_ = 3;
          auVar115._0_8_ = 0x300000003;
          auVar115._12_4_ = 3;
          auVar115._16_4_ = 3;
          auVar115._20_4_ = 3;
          auVar115._24_4_ = 3;
          auVar115._28_4_ = 3;
          auVar134._8_4_ = 2;
          auVar134._0_8_ = 0x200000002;
          auVar134._12_4_ = 2;
          auVar134._16_4_ = 2;
          auVar134._20_4_ = 2;
          auVar134._24_4_ = 2;
          auVar134._28_4_ = 2;
          auVar88 = vblendvps_avx(auVar134,auVar115,auVar88);
          local_620._4_4_ = local_b2c;
          local_620._0_4_ = local_b2c;
          local_620._8_4_ = local_b2c;
          local_620._12_4_ = local_b2c;
          local_620._16_4_ = local_b2c;
          local_620._20_4_ = local_b2c;
          local_620._24_4_ = local_b2c;
          local_620._28_4_ = local_b2c;
          _local_5e0 = vpcmpgtd_avx2(auVar88,local_620);
          auVar88 = vpandn_avx2(_local_5e0,local_5c0);
          local_780._4_4_ = local_680._4_4_ + (float)local_800._4_4_;
          local_780._0_4_ = local_680._0_4_ + (float)local_800._0_4_;
          fStack_778 = local_680._8_4_ + fStack_7f8;
          fStack_774 = local_680._12_4_ + fStack_7f4;
          fStack_770 = local_680._16_4_ + fStack_7f0;
          fStack_76c = local_680._20_4_ + fStack_7ec;
          fStack_768 = local_680._24_4_ + fStack_7e8;
          fStack_764 = local_680._28_4_ + fStack_7e4;
          local_860 = auVar11;
          while( true ) {
            local_440 = auVar88;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0xbf,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar88[0x1f]) break;
            auVar116._8_4_ = 0x7f800000;
            auVar116._0_8_ = 0x7f8000007f800000;
            auVar116._12_4_ = 0x7f800000;
            auVar116._16_4_ = 0x7f800000;
            auVar116._20_4_ = 0x7f800000;
            auVar116._24_4_ = 0x7f800000;
            auVar116._28_4_ = 0x7f800000;
            auVar268 = vblendvps_avx(auVar116,local_680,auVar88);
            auVar9 = vshufps_avx(auVar268,auVar268,0xb1);
            auVar9 = vminps_avx(auVar268,auVar9);
            auVar10 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vminps_avx(auVar9,auVar10);
            auVar10 = vpermpd_avx2(auVar9,0x4e);
            auVar9 = vminps_avx(auVar9,auVar10);
            auVar268 = vcmpps_avx(auVar268,auVar9,0);
            auVar9 = auVar88 & auVar268;
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0x7f,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0xbf,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar268,auVar88);
            }
            uVar66 = vmovmskps_avx(auVar88);
            iVar12 = 0;
            for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar71 = iVar12 << 2;
            *(undefined4 *)(local_440 + uVar71) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_a20._0_16_ = (undefined1  [16])aVar1;
            auVar3 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar66 = *(uint *)(local_1a0 + uVar71);
            uVar71 = *(uint *)(local_4e0 + uVar71);
            if (auVar3._0_4_ < 0.0) {
              auVar234 = ZEXT1664(auVar234._0_16_);
              fVar229 = sqrtf(auVar3._0_4_);
            }
            else {
              auVar3 = vsqrtss_avx(auVar3,auVar3);
              fVar229 = auVar3._0_4_;
            }
            auVar169 = vminps_avx(local_a50,local_a70);
            auVar3 = vmaxps_avx(local_a50,local_a70);
            auVar183 = vminps_avx(local_a60,_local_a80);
            auVar82 = vminps_avx(auVar169,auVar183);
            auVar169 = vmaxps_avx(local_a60,_local_a80);
            auVar183 = vmaxps_avx(auVar3,auVar169);
            local_900._8_4_ = 0x7fffffff;
            local_900._0_8_ = 0x7fffffff7fffffff;
            local_900._12_4_ = 0x7fffffff;
            auVar3 = vandps_avx(auVar82,local_900._0_16_);
            auVar169 = vandps_avx(auVar183,local_900._0_16_);
            auVar3 = vmaxps_avx(auVar3,auVar169);
            auVar169 = vmovshdup_avx(auVar3);
            auVar169 = vmaxss_avx(auVar169,auVar3);
            auVar3 = vshufpd_avx(auVar3,auVar3,1);
            auVar3 = vmaxss_avx(auVar3,auVar169);
            local_840._0_4_ = auVar3._0_4_ * 1.9073486e-06;
            local_860._0_4_ = fVar229 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar183,auVar183,0xff);
            auVar3 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar66),0x10);
            auVar211 = ZEXT1664(auVar3);
            lVar70 = 5;
            do {
              do {
                bVar75 = lVar70 == 0;
                lVar70 = lVar70 + -1;
                if (bVar75) goto LAB_012bdd14;
                auVar192 = auVar211._0_16_;
                local_9a0._0_16_ = vmovshdup_avx(auVar192);
                fVar237 = 1.0 - local_9a0._0_4_;
                auVar3 = vshufps_avx(auVar192,auVar192,0x55);
                fVar229 = auVar3._0_4_;
                auVar99._0_4_ = local_a70._0_4_ * fVar229;
                fVar124 = auVar3._4_4_;
                auVar99._4_4_ = local_a70._4_4_ * fVar124;
                fVar236 = auVar3._8_4_;
                auVar99._8_4_ = local_a70._8_4_ * fVar236;
                fVar138 = auVar3._12_4_;
                auVar99._12_4_ = local_a70._12_4_ * fVar138;
                auVar125._4_4_ = fVar237;
                auVar125._0_4_ = fVar237;
                auVar125._8_4_ = fVar237;
                auVar125._12_4_ = fVar237;
                auVar3 = vfmadd231ps_fma(auVar99,auVar125,local_a50);
                auVar144._0_4_ = local_a60._0_4_ * fVar229;
                auVar144._4_4_ = local_a60._4_4_ * fVar124;
                auVar144._8_4_ = local_a60._8_4_ * fVar236;
                auVar144._12_4_ = local_a60._12_4_ * fVar138;
                auVar169 = vfmadd231ps_fma(auVar144,auVar125,local_a70);
                auVar182._0_4_ = fVar229 * auVar169._0_4_;
                auVar182._4_4_ = fVar124 * auVar169._4_4_;
                auVar182._8_4_ = fVar236 * auVar169._8_4_;
                auVar182._12_4_ = fVar138 * auVar169._12_4_;
                auVar183 = vfmadd231ps_fma(auVar182,auVar125,auVar3);
                auVar100._0_4_ = fVar229 * (float)local_a80._0_4_;
                auVar100._4_4_ = fVar124 * (float)local_a80._4_4_;
                auVar100._8_4_ = fVar236 * fStack_a78;
                auVar100._12_4_ = fVar138 * fStack_a74;
                auVar3 = vfmadd231ps_fma(auVar100,auVar125,local_a60);
                auVar168._0_4_ = fVar229 * auVar3._0_4_;
                auVar168._4_4_ = fVar124 * auVar3._4_4_;
                auVar168._8_4_ = fVar236 * auVar3._8_4_;
                auVar168._12_4_ = fVar138 * auVar3._12_4_;
                auVar169 = vfmadd231ps_fma(auVar168,auVar125,auVar169);
                uVar73 = auVar211._0_4_;
                auVar101._4_4_ = uVar73;
                auVar101._0_4_ = uVar73;
                auVar101._8_4_ = uVar73;
                auVar101._12_4_ = uVar73;
                auVar3 = vfmadd213ps_fma(auVar101,local_a20._0_16_,_DAT_01f45a50);
                auVar81._0_4_ = fVar229 * auVar169._0_4_;
                auVar81._4_4_ = fVar124 * auVar169._4_4_;
                auVar81._8_4_ = fVar236 * auVar169._8_4_;
                auVar81._12_4_ = fVar138 * auVar169._12_4_;
                auVar82 = vfmadd231ps_fma(auVar81,auVar183,auVar125);
                local_6a0._0_16_ = auVar82;
                auVar3 = vsubps_avx(auVar3,auVar82);
                _local_7c0 = auVar3;
                auVar3 = vdpps_avx(auVar3,auVar3,0x7f);
                fVar229 = auVar3._0_4_;
                if (fVar229 < 0.0) {
                  local_9c0._0_16_ = ZEXT416((uint)fVar237);
                  local_9e0._0_16_ = auVar183;
                  local_920._0_16_ = auVar169;
                  auVar259._0_4_ = sqrtf(fVar229);
                  auVar259._4_60_ = extraout_var;
                  auVar211 = ZEXT1664(auVar192);
                  auVar82 = auVar259._0_16_;
                  auVar169 = local_920._0_16_;
                  auVar183 = local_9e0._0_16_;
                  auVar217 = local_9c0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar3,auVar3);
                  auVar217 = ZEXT416((uint)fVar237);
                }
                auVar169 = vsubps_avx(auVar169,auVar183);
                auVar200._0_4_ = auVar169._0_4_ * 3.0;
                auVar200._4_4_ = auVar169._4_4_ * 3.0;
                auVar200._8_4_ = auVar169._8_4_ * 3.0;
                auVar200._12_4_ = auVar169._12_4_ * 3.0;
                auVar169 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,local_9a0._0_16_)
                ;
                auVar183 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9a0._0_16_,auVar217)
                ;
                fVar124 = auVar217._0_4_ * 6.0;
                fVar236 = auVar169._0_4_ * 6.0;
                fVar138 = auVar183._0_4_ * 6.0;
                fVar237 = local_9a0._0_4_ * 6.0;
                auVar145._0_4_ = fVar237 * (float)local_a80._0_4_;
                auVar145._4_4_ = fVar237 * (float)local_a80._4_4_;
                auVar145._8_4_ = fVar237 * fStack_a78;
                auVar145._12_4_ = fVar237 * fStack_a74;
                auVar102._4_4_ = fVar138;
                auVar102._0_4_ = fVar138;
                auVar102._8_4_ = fVar138;
                auVar102._12_4_ = fVar138;
                auVar169 = vfmadd132ps_fma(auVar102,auVar145,local_a60);
                auVar146._4_4_ = fVar236;
                auVar146._0_4_ = fVar236;
                auVar146._8_4_ = fVar236;
                auVar146._12_4_ = fVar236;
                auVar169 = vfmadd132ps_fma(auVar146,auVar169,local_a70);
                auVar183 = vdpps_avx(auVar200,auVar200,0x7f);
                auVar103._4_4_ = fVar124;
                auVar103._0_4_ = fVar124;
                auVar103._8_4_ = fVar124;
                auVar103._12_4_ = fVar124;
                auVar128 = vfmadd132ps_fma(auVar103,auVar169,local_a50);
                auVar169 = vblendps_avx(auVar183,_DAT_01f45a50,0xe);
                auVar217 = vrsqrtss_avx(auVar169,auVar169);
                fVar138 = auVar183._0_4_;
                fVar124 = auVar217._0_4_;
                auVar217 = vdpps_avx(auVar200,auVar128,0x7f);
                fVar124 = fVar124 * 1.5 + fVar138 * -0.5 * fVar124 * fVar124 * fVar124;
                auVar104._0_4_ = auVar128._0_4_ * fVar138;
                auVar104._4_4_ = auVar128._4_4_ * fVar138;
                auVar104._8_4_ = auVar128._8_4_ * fVar138;
                auVar104._12_4_ = auVar128._12_4_ * fVar138;
                fVar236 = auVar217._0_4_;
                auVar184._0_4_ = auVar200._0_4_ * fVar236;
                auVar184._4_4_ = auVar200._4_4_ * fVar236;
                auVar184._8_4_ = auVar200._8_4_ * fVar236;
                auVar184._12_4_ = auVar200._12_4_ * fVar236;
                auVar217 = vsubps_avx(auVar104,auVar184);
                auVar169 = vrcpss_avx(auVar169,auVar169);
                auVar128 = vfnmadd213ss_fma(auVar169,auVar183,ZEXT416(0x40000000));
                fVar236 = auVar169._0_4_ * auVar128._0_4_;
                auVar169 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                      ZEXT416((uint)(auVar211._0_4_ * (float)local_860._0_4_)));
                auVar223 = ZEXT1664(auVar169);
                uVar13 = CONCAT44(auVar200._4_4_,auVar200._0_4_);
                auVar193._0_8_ = uVar13 ^ 0x8000000080000000;
                auVar193._8_4_ = -auVar200._8_4_;
                auVar193._12_4_ = -auVar200._12_4_;
                auVar147._0_4_ = fVar124 * auVar217._0_4_ * fVar236;
                auVar147._4_4_ = fVar124 * auVar217._4_4_ * fVar236;
                auVar147._8_4_ = fVar124 * auVar217._8_4_ * fVar236;
                auVar147._12_4_ = fVar124 * auVar217._12_4_ * fVar236;
                auVar244._0_4_ = auVar200._0_4_ * fVar124;
                auVar244._4_4_ = auVar200._4_4_ * fVar124;
                auVar244._8_4_ = auVar200._8_4_ * fVar124;
                auVar244._12_4_ = auVar200._12_4_ * fVar124;
                local_9a0._0_16_ = auVar200;
                local_9c0._0_4_ = auVar169._0_4_;
                if (fVar138 < -fVar138) {
                  local_9e0._0_4_ = auVar82._0_4_;
                  local_920._0_16_ = auVar193;
                  local_940._0_16_ = auVar244;
                  local_a40._0_16_ = auVar147;
                  fVar124 = sqrtf(fVar138);
                  auVar82 = ZEXT416((uint)local_9e0._0_4_);
                  auVar223 = ZEXT464((uint)local_9c0._0_4_);
                  auVar147 = local_a40._0_16_;
                  auVar193 = local_920._0_16_;
                  auVar244 = local_940._0_16_;
                }
                else {
                  auVar169 = vsqrtss_avx(auVar183,auVar183);
                  fVar124 = auVar169._0_4_;
                }
                auVar169 = vdpps_avx(_local_7c0,auVar244,0x7f);
                auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar82,auVar223._0_16_);
                auVar183 = vdpps_avx(auVar193,auVar244,0x7f);
                auVar217 = vdpps_avx(_local_7c0,auVar147,0x7f);
                auVar128 = vdpps_avx(local_a20._0_16_,auVar244,0x7f);
                auVar4 = vfmadd213ss_fma(ZEXT416((uint)(auVar82._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_840._0_4_ / fVar124)),auVar4);
                fVar124 = auVar183._0_4_ + auVar217._0_4_;
                auVar83._0_4_ = auVar169._0_4_ * auVar169._0_4_;
                auVar83._4_4_ = auVar169._4_4_ * auVar169._4_4_;
                auVar83._8_4_ = auVar169._8_4_ * auVar169._8_4_;
                auVar83._12_4_ = auVar169._12_4_ * auVar169._12_4_;
                auVar183 = vdpps_avx(_local_7c0,auVar193,0x7f);
                auVar217 = vsubps_avx(auVar3,auVar83);
                auVar82 = vrsqrtss_avx(auVar217,auVar217);
                fVar138 = auVar217._0_4_;
                fVar236 = auVar82._0_4_;
                fVar236 = fVar236 * 1.5 + fVar138 * -0.5 * fVar236 * fVar236 * fVar236;
                auVar82 = vdpps_avx(_local_7c0,local_a20._0_16_,0x7f);
                auVar183 = vfnmadd231ss_fma(auVar183,auVar169,ZEXT416((uint)fVar124));
                auVar82 = vfnmadd231ss_fma(auVar82,auVar169,auVar128);
                if (fVar138 < 0.0) {
                  local_9e0._0_16_ = auVar169;
                  local_920._0_4_ = auVar4._0_4_;
                  local_940._0_16_ = ZEXT416((uint)fVar124);
                  local_a40._0_16_ = auVar128;
                  local_6c0._0_16_ = auVar183;
                  local_6e0._0_4_ = fVar236;
                  local_700._0_16_ = auVar82;
                  fVar138 = sqrtf(fVar138);
                  auVar223 = ZEXT464((uint)local_9c0._0_4_);
                  fVar236 = (float)local_6e0._0_4_;
                  auVar82 = local_700._0_16_;
                  auVar183 = local_6c0._0_16_;
                  auVar169 = local_9e0._0_16_;
                  auVar128 = local_a40._0_16_;
                  auVar217 = local_940._0_16_;
                  fVar124 = (float)local_920._0_4_;
                }
                else {
                  auVar217 = vsqrtss_avx(auVar217,auVar217);
                  fVar138 = auVar217._0_4_;
                  auVar217 = ZEXT416((uint)fVar124);
                  fVar124 = auVar4._0_4_;
                }
                auVar234 = ZEXT1664(auVar169);
                auVar4 = vpermilps_avx(local_6a0._0_16_,0xff);
                fVar138 = fVar138 - auVar4._0_4_;
                auVar4 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
                auVar183 = vfmsub213ss_fma(auVar183,ZEXT416((uint)fVar236),auVar4);
                auVar148._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
                auVar148._8_4_ = auVar128._8_4_ ^ 0x80000000;
                auVar148._12_4_ = auVar128._12_4_ ^ 0x80000000;
                auVar170._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = auVar183._8_4_ ^ 0x80000000;
                auVar170._12_4_ = auVar183._12_4_ ^ 0x80000000;
                auVar78 = ZEXT416((uint)(auVar82._0_4_ * fVar236));
                auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar128._0_4_ * auVar183._0_4_)),auVar217,
                                          auVar78);
                auVar183 = vinsertps_avx(auVar170,auVar78,0x1c);
                uVar73 = auVar82._0_4_;
                auVar171._4_4_ = uVar73;
                auVar171._0_4_ = uVar73;
                auVar171._8_4_ = uVar73;
                auVar171._12_4_ = uVar73;
                auVar183 = vdivps_avx(auVar183,auVar171);
                auVar82 = vinsertps_avx(auVar217,auVar148,0x10);
                auVar82 = vdivps_avx(auVar82,auVar171);
                fVar236 = auVar169._0_4_;
                auVar126._0_4_ = fVar236 * auVar183._0_4_ + fVar138 * auVar82._0_4_;
                auVar126._4_4_ = fVar236 * auVar183._4_4_ + fVar138 * auVar82._4_4_;
                auVar126._8_4_ = fVar236 * auVar183._8_4_ + fVar138 * auVar82._8_4_;
                auVar126._12_4_ = fVar236 * auVar183._12_4_ + fVar138 * auVar82._12_4_;
                auVar82 = vsubps_avx(auVar192,auVar126);
                auVar211 = ZEXT1664(auVar82);
                auVar183 = vandps_avx(auVar169,local_900._0_16_);
              } while (fVar124 <= auVar183._0_4_);
              auVar192 = vfmadd231ss_fma(ZEXT416((uint)(auVar223._0_4_ + fVar124)),local_720._0_16_,
                                         ZEXT416(0x36000000));
              auVar183 = vandps_avx(ZEXT416((uint)fVar138),local_900._0_16_);
            } while (auVar192._0_4_ <= auVar183._0_4_);
            fVar124 = auVar82._0_4_ + (float)local_7a0._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar124) &&
               (fVar236 = (ray->super_RayK<1>).tfar, fVar124 <= fVar236)) {
              auVar183 = vmovshdup_avx(auVar82);
              fVar138 = auVar183._0_4_;
              if ((0.0 <= fVar138) && (fVar138 <= 1.0)) {
                auVar3 = vrsqrtss_avx(auVar3,auVar3);
                fVar237 = auVar3._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar229 = fVar237 * 1.5 + fVar229 * -0.5 * fVar237 * fVar237 * fVar237;
                  auVar149._0_4_ = fVar229 * (float)local_7c0._0_4_;
                  auVar149._4_4_ = fVar229 * (float)local_7c0._4_4_;
                  auVar149._8_4_ = fVar229 * fStack_7b8;
                  auVar149._12_4_ = fVar229 * fStack_7b4;
                  auVar192 = vfmadd213ps_fma(auVar4,auVar149,local_9a0._0_16_);
                  auVar3 = vshufps_avx(auVar149,auVar149,0xc9);
                  auVar183 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                  auVar150._0_4_ = auVar149._0_4_ * auVar183._0_4_;
                  auVar150._4_4_ = auVar149._4_4_ * auVar183._4_4_;
                  auVar150._8_4_ = auVar149._8_4_ * auVar183._8_4_;
                  auVar150._12_4_ = auVar149._12_4_ * auVar183._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar150,local_9a0._0_16_,auVar3);
                  auVar3 = vshufps_avx(auVar82,auVar82,0xc9);
                  auVar183 = vshufps_avx(auVar192,auVar192,0xc9);
                  auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                  auVar84._0_4_ = auVar192._0_4_ * auVar82._0_4_;
                  auVar84._4_4_ = auVar192._4_4_ * auVar82._4_4_;
                  auVar84._8_4_ = auVar192._8_4_ * auVar82._8_4_;
                  auVar84._12_4_ = auVar192._12_4_ * auVar82._12_4_;
                  auVar183 = vfmsub231ps_fma(auVar84,auVar3,auVar183);
                  auVar3 = vshufps_avx(auVar183,auVar183,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar124;
                    uVar77 = vmovlps_avx(auVar3);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar77;
                    (ray->Ng).field_0.field_0.z = auVar183._0_4_;
                    ray->u = fVar138;
                    ray->v = 0.0;
                    ray->primID = local_820._0_4_;
                    ray->geomID = uVar67;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_970 = vmovlps_avx(auVar3);
                    local_968 = auVar183._0_4_;
                    local_964 = fVar138;
                    local_960 = 0;
                    local_95c = local_820._0_4_;
                    local_958 = uVar67;
                    local_954 = context->user->instID[0];
                    local_950 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar124;
                    local_640._0_4_ = 0xffffffff;
                    local_ab8.valid = (int *)local_640;
                    local_ab8.geometryUserPtr = pGVar6->userPtr;
                    local_ab8.context = context->user;
                    local_ab8.hit = (RTCHitN *)&local_970;
                    local_ab8.N = 1;
                    local_ab8.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012bde24:
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar234 = ZEXT1664(auVar234._0_16_);
                        (*p_Var7)(&local_ab8);
                        if (*local_ab8.valid == 0) goto LAB_012bdec0;
                      }
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                           *(float *)local_ab8.hit;
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_ab8.hit + 4);
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_ab8.hit + 8);
                      *(float *)((long)local_ab8.ray + 0x3c) = *(float *)(local_ab8.hit + 0xc);
                      *(float *)((long)local_ab8.ray + 0x40) = *(float *)(local_ab8.hit + 0x10);
                      *(float *)((long)local_ab8.ray + 0x44) = *(float *)(local_ab8.hit + 0x14);
                      *(float *)((long)local_ab8.ray + 0x48) = *(float *)(local_ab8.hit + 0x18);
                      *(float *)((long)local_ab8.ray + 0x4c) = *(float *)(local_ab8.hit + 0x1c);
                      *(float *)((long)local_ab8.ray + 0x50) = *(float *)(local_ab8.hit + 0x20);
                    }
                    else {
                      auVar234 = ZEXT1664(auVar169);
                      (*pGVar6->intersectionFilterN)(&local_ab8);
                      if (*local_ab8.valid != 0) goto LAB_012bde24;
LAB_012bdec0:
                      (ray->super_RayK<1>).tfar = fVar236;
                    }
                  }
                }
              }
            }
LAB_012bdd14:
            fVar229 = (ray->super_RayK<1>).tfar;
            auVar94._4_4_ = fVar229;
            auVar94._0_4_ = fVar229;
            auVar94._8_4_ = fVar229;
            auVar94._12_4_ = fVar229;
            auVar94._16_4_ = fVar229;
            auVar94._20_4_ = fVar229;
            auVar94._24_4_ = fVar229;
            auVar94._28_4_ = fVar229;
            auVar88 = vcmpps_avx(_local_780,auVar94,2);
            auVar88 = vandps_avx(auVar88,local_440);
          }
          auVar95._0_4_ = (float)local_800._0_4_ + (float)local_740._0_4_;
          auVar95._4_4_ = (float)local_800._4_4_ + (float)local_740._4_4_;
          auVar95._8_4_ = fStack_7f8 + fStack_738;
          auVar95._12_4_ = fStack_7f4 + fStack_734;
          auVar95._16_4_ = fStack_7f0 + fStack_730;
          auVar95._20_4_ = fStack_7ec + fStack_72c;
          auVar95._24_4_ = fStack_7e8 + fStack_728;
          auVar95._28_4_ = fStack_7e4 + fStack_724;
          fVar124 = (ray->super_RayK<1>).tfar;
          fVar229 = (ray->super_RayK<1>).tfar;
          auVar135._4_4_ = fVar229;
          auVar135._0_4_ = fVar229;
          auVar135._8_4_ = fVar229;
          auVar135._12_4_ = fVar229;
          auVar135._16_4_ = fVar229;
          auVar135._20_4_ = fVar229;
          auVar135._24_4_ = fVar229;
          auVar135._28_4_ = fVar229;
          auVar88 = vcmpps_avx(auVar95,auVar135,2);
          local_760 = vandps_avx(auVar88,local_760);
          auVar96._8_4_ = 3;
          auVar96._0_8_ = 0x300000003;
          auVar96._12_4_ = 3;
          auVar96._16_4_ = 3;
          auVar96._20_4_ = 3;
          auVar96._24_4_ = 3;
          auVar96._28_4_ = 3;
          auVar136._8_4_ = 2;
          auVar136._0_8_ = 0x200000002;
          auVar136._12_4_ = 2;
          auVar136._16_4_ = 2;
          auVar136._20_4_ = 2;
          auVar136._24_4_ = 2;
          auVar136._28_4_ = 2;
          auVar88 = vblendvps_avx(auVar136,auVar96,local_600);
          _local_780 = vpcmpgtd_avx2(auVar88,local_620);
          auVar88 = vpandn_avx2(_local_780,local_760);
          local_680 = _local_520;
          local_740._4_4_ = (float)local_800._4_4_ + (float)local_520._4_4_;
          local_740._0_4_ = (float)local_800._0_4_ + (float)local_520._0_4_;
          fStack_738 = fStack_7f8 + fStack_518;
          fStack_734 = fStack_7f4 + fStack_514;
          fStack_730 = fStack_7f0 + fStack_510;
          fStack_72c = fStack_7ec + fStack_50c;
          fStack_728 = fStack_7e8 + fStack_508;
          fStack_724 = fStack_7e4 + fStack_504;
          auVar228 = ZEXT3264(local_880);
          auVar254 = ZEXT3264(local_8a0);
          auVar211 = ZEXT3264(local_a00);
          auVar259 = ZEXT3264(local_8c0);
          auVar223 = ZEXT3264(local_8e0);
          fVar229 = (float)local_800._0_4_;
          fVar236 = (float)local_800._4_4_;
          fVar237 = fStack_7f8;
          fVar238 = fStack_7f4;
          fVar239 = fStack_7f0;
          fVar240 = fStack_7ec;
          fVar241 = fStack_7e8;
          fVar242 = fStack_7e4;
          while( true ) {
            local_640 = auVar88;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0xbf,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar88[0x1f]) break;
            auVar117._8_4_ = 0x7f800000;
            auVar117._0_8_ = 0x7f8000007f800000;
            auVar117._12_4_ = 0x7f800000;
            auVar117._16_4_ = 0x7f800000;
            auVar117._20_4_ = 0x7f800000;
            auVar117._24_4_ = 0x7f800000;
            auVar117._28_4_ = 0x7f800000;
            auVar268 = vblendvps_avx(auVar117,local_680,auVar88);
            auVar9 = vshufps_avx(auVar268,auVar268,0xb1);
            auVar9 = vminps_avx(auVar268,auVar9);
            auVar10 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vminps_avx(auVar9,auVar10);
            auVar10 = vpermpd_avx2(auVar9,0x4e);
            auVar9 = vminps_avx(auVar9,auVar10);
            auVar268 = vcmpps_avx(auVar268,auVar9,0);
            auVar9 = auVar88 & auVar268;
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0x7f,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0xbf,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar268,auVar88);
            }
            uVar66 = vmovmskps_avx(auVar88);
            iVar12 = 0;
            for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar71 = iVar12 << 2;
            *(undefined4 *)(local_640 + uVar71) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_a20._0_16_ = (undefined1  [16])aVar1;
            auVar3 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar66 = *(uint *)(local_1c0 + uVar71);
            uVar71 = *(uint *)(local_500 + uVar71);
            if (auVar3._0_4_ < 0.0) {
              auVar234 = ZEXT1664(auVar234._0_16_);
              fVar229 = sqrtf(auVar3._0_4_);
              auVar223 = ZEXT3264(local_8e0);
              auVar259 = ZEXT3264(local_8c0);
              auVar211 = ZEXT3264(local_a00);
              auVar254 = ZEXT3264(local_8a0);
              auVar228 = ZEXT3264(local_880);
            }
            else {
              auVar3 = vsqrtss_avx(auVar3,auVar3);
              fVar229 = auVar3._0_4_;
            }
            auVar169 = vminps_avx(local_a50,local_a70);
            auVar3 = vmaxps_avx(local_a50,local_a70);
            auVar183 = vminps_avx(local_a60,_local_a80);
            auVar82 = vminps_avx(auVar169,auVar183);
            auVar169 = vmaxps_avx(local_a60,_local_a80);
            auVar183 = vmaxps_avx(auVar3,auVar169);
            local_920._8_4_ = 0x7fffffff;
            local_920._0_8_ = 0x7fffffff7fffffff;
            local_920._12_4_ = 0x7fffffff;
            auVar3 = vandps_avx(auVar82,local_920._0_16_);
            auVar169 = vandps_avx(auVar183,local_920._0_16_);
            auVar3 = vmaxps_avx(auVar3,auVar169);
            auVar169 = vmovshdup_avx(auVar3);
            auVar169 = vmaxss_avx(auVar169,auVar3);
            auVar3 = vshufpd_avx(auVar3,auVar3,1);
            auVar3 = vmaxss_avx(auVar3,auVar169);
            local_840._0_4_ = auVar3._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar229 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar183,auVar183,0xff);
            auVar3 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar66),0x10);
            auVar199 = ZEXT1664(auVar3);
            lVar70 = 5;
            do {
              do {
                bVar75 = lVar70 == 0;
                lVar70 = lVar70 + -1;
                if (bVar75) goto LAB_012be726;
                auVar192 = auVar199._0_16_;
                local_9a0._0_16_ = vmovshdup_avx(auVar192);
                fVar237 = 1.0 - local_9a0._0_4_;
                auVar3 = vshufps_avx(auVar192,auVar192,0x55);
                fVar229 = auVar3._0_4_;
                auVar105._0_4_ = local_a70._0_4_ * fVar229;
                fVar124 = auVar3._4_4_;
                auVar105._4_4_ = local_a70._4_4_ * fVar124;
                fVar236 = auVar3._8_4_;
                auVar105._8_4_ = local_a70._8_4_ * fVar236;
                fVar138 = auVar3._12_4_;
                auVar105._12_4_ = local_a70._12_4_ * fVar138;
                auVar127._4_4_ = fVar237;
                auVar127._0_4_ = fVar237;
                auVar127._8_4_ = fVar237;
                auVar127._12_4_ = fVar237;
                auVar3 = vfmadd231ps_fma(auVar105,auVar127,local_a50);
                auVar151._0_4_ = local_a60._0_4_ * fVar229;
                auVar151._4_4_ = local_a60._4_4_ * fVar124;
                auVar151._8_4_ = local_a60._8_4_ * fVar236;
                auVar151._12_4_ = local_a60._12_4_ * fVar138;
                auVar169 = vfmadd231ps_fma(auVar151,auVar127,local_a70);
                auVar185._0_4_ = fVar229 * auVar169._0_4_;
                auVar185._4_4_ = fVar124 * auVar169._4_4_;
                auVar185._8_4_ = fVar236 * auVar169._8_4_;
                auVar185._12_4_ = fVar138 * auVar169._12_4_;
                auVar183 = vfmadd231ps_fma(auVar185,auVar127,auVar3);
                auVar106._0_4_ = fVar229 * (float)local_a80._0_4_;
                auVar106._4_4_ = fVar124 * (float)local_a80._4_4_;
                auVar106._8_4_ = fVar236 * fStack_a78;
                auVar106._12_4_ = fVar138 * fStack_a74;
                auVar3 = vfmadd231ps_fma(auVar106,auVar127,local_a60);
                auVar172._0_4_ = fVar229 * auVar3._0_4_;
                auVar172._4_4_ = fVar124 * auVar3._4_4_;
                auVar172._8_4_ = fVar236 * auVar3._8_4_;
                auVar172._12_4_ = fVar138 * auVar3._12_4_;
                auVar169 = vfmadd231ps_fma(auVar172,auVar127,auVar169);
                uVar73 = auVar199._0_4_;
                auVar107._4_4_ = uVar73;
                auVar107._0_4_ = uVar73;
                auVar107._8_4_ = uVar73;
                auVar107._12_4_ = uVar73;
                auVar3 = vfmadd213ps_fma(auVar107,local_a20._0_16_,_DAT_01f45a50);
                auVar85._0_4_ = fVar229 * auVar169._0_4_;
                auVar85._4_4_ = fVar124 * auVar169._4_4_;
                auVar85._8_4_ = fVar236 * auVar169._8_4_;
                auVar85._12_4_ = fVar138 * auVar169._12_4_;
                auVar82 = vfmadd231ps_fma(auVar85,auVar183,auVar127);
                local_6a0._0_16_ = auVar82;
                auVar3 = vsubps_avx(auVar3,auVar82);
                _local_7c0 = auVar3;
                auVar3 = vdpps_avx(auVar3,auVar3,0x7f);
                fVar229 = auVar3._0_4_;
                if (fVar229 < 0.0) {
                  local_9c0._0_16_ = ZEXT416((uint)fVar237);
                  local_900._0_16_ = auVar183;
                  local_860._0_16_ = auVar169;
                  auVar254._0_4_ = sqrtf(fVar229);
                  auVar254._4_60_ = extraout_var_00;
                  auVar199 = ZEXT1664(auVar192);
                  auVar82 = auVar254._0_16_;
                  auVar169 = local_860._0_16_;
                  auVar183 = local_900._0_16_;
                  auVar217 = local_9c0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar3,auVar3);
                  auVar217 = ZEXT416((uint)fVar237);
                }
                auVar169 = vsubps_avx(auVar169,auVar183);
                auVar201._0_4_ = auVar169._0_4_ * 3.0;
                auVar201._4_4_ = auVar169._4_4_ * 3.0;
                auVar201._8_4_ = auVar169._8_4_ * 3.0;
                auVar201._12_4_ = auVar169._12_4_ * 3.0;
                auVar169 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217,local_9a0._0_16_)
                ;
                auVar183 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9a0._0_16_,auVar217)
                ;
                fVar124 = auVar217._0_4_ * 6.0;
                fVar236 = auVar169._0_4_ * 6.0;
                fVar138 = auVar183._0_4_ * 6.0;
                fVar237 = local_9a0._0_4_ * 6.0;
                auVar152._0_4_ = fVar237 * (float)local_a80._0_4_;
                auVar152._4_4_ = fVar237 * (float)local_a80._4_4_;
                auVar152._8_4_ = fVar237 * fStack_a78;
                auVar152._12_4_ = fVar237 * fStack_a74;
                auVar108._4_4_ = fVar138;
                auVar108._0_4_ = fVar138;
                auVar108._8_4_ = fVar138;
                auVar108._12_4_ = fVar138;
                auVar169 = vfmadd132ps_fma(auVar108,auVar152,local_a60);
                auVar153._4_4_ = fVar236;
                auVar153._0_4_ = fVar236;
                auVar153._8_4_ = fVar236;
                auVar153._12_4_ = fVar236;
                auVar169 = vfmadd132ps_fma(auVar153,auVar169,local_a70);
                auVar183 = vdpps_avx(auVar201,auVar201,0x7f);
                auVar109._4_4_ = fVar124;
                auVar109._0_4_ = fVar124;
                auVar109._8_4_ = fVar124;
                auVar109._12_4_ = fVar124;
                auVar128 = vfmadd132ps_fma(auVar109,auVar169,local_a50);
                auVar169 = vblendps_avx(auVar183,_DAT_01f45a50,0xe);
                auVar217 = vrsqrtss_avx(auVar169,auVar169);
                fVar138 = auVar183._0_4_;
                fVar124 = auVar217._0_4_;
                auVar217 = vdpps_avx(auVar201,auVar128,0x7f);
                fVar124 = fVar124 * 1.5 + fVar138 * -0.5 * fVar124 * fVar124 * fVar124;
                auVar110._0_4_ = auVar128._0_4_ * fVar138;
                auVar110._4_4_ = auVar128._4_4_ * fVar138;
                auVar110._8_4_ = auVar128._8_4_ * fVar138;
                auVar110._12_4_ = auVar128._12_4_ * fVar138;
                fVar236 = auVar217._0_4_;
                auVar186._0_4_ = auVar201._0_4_ * fVar236;
                auVar186._4_4_ = auVar201._4_4_ * fVar236;
                auVar186._8_4_ = auVar201._8_4_ * fVar236;
                auVar186._12_4_ = auVar201._12_4_ * fVar236;
                auVar217 = vsubps_avx(auVar110,auVar186);
                auVar169 = vrcpss_avx(auVar169,auVar169);
                auVar128 = vfnmadd213ss_fma(auVar169,auVar183,ZEXT416(0x40000000));
                fVar236 = auVar169._0_4_ * auVar128._0_4_;
                auVar169 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                      ZEXT416((uint)(auVar199._0_4_ * (float)local_940._0_4_)));
                uVar13 = CONCAT44(auVar201._4_4_,auVar201._0_4_);
                auVar224._0_8_ = uVar13 ^ 0x8000000080000000;
                auVar224._8_4_ = -auVar201._8_4_;
                auVar224._12_4_ = -auVar201._12_4_;
                auVar154._0_4_ = fVar124 * auVar217._0_4_ * fVar236;
                auVar154._4_4_ = fVar124 * auVar217._4_4_ * fVar236;
                auVar154._8_4_ = fVar124 * auVar217._8_4_ * fVar236;
                auVar154._12_4_ = fVar124 * auVar217._12_4_ * fVar236;
                local_9e0._0_4_ = auVar201._0_4_ * fVar124;
                local_9e0._4_4_ = auVar201._4_4_ * fVar124;
                local_9e0._8_4_ = auVar201._8_4_ * fVar124;
                local_9e0._12_4_ = auVar201._12_4_ * fVar124;
                local_9a0._0_16_ = auVar201;
                local_9c0._0_4_ = auVar169._0_4_;
                if (fVar138 < -fVar138) {
                  local_900._0_4_ = auVar82._0_4_;
                  local_860._0_16_ = auVar224;
                  local_a40._0_16_ = auVar154;
                  fVar124 = sqrtf(fVar138);
                  auVar82 = ZEXT416((uint)local_900._0_4_);
                  auVar169 = ZEXT416((uint)local_9c0._0_4_);
                  auVar154 = local_a40._0_16_;
                  auVar224 = local_860._0_16_;
                }
                else {
                  auVar183 = vsqrtss_avx(auVar183,auVar183);
                  fVar124 = auVar183._0_4_;
                }
                local_900._0_16_ = vdpps_avx(_local_7c0,local_9e0._0_16_,0x7f);
                auVar128 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar82,auVar169);
                auVar169 = vdpps_avx(auVar224,local_9e0._0_16_,0x7f);
                auVar183 = vdpps_avx(_local_7c0,auVar154,0x7f);
                auVar217 = vdpps_avx(local_a20._0_16_,local_9e0._0_16_,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)(auVar82._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_840._0_4_ / fVar124)),auVar128
                                         );
                local_860._0_4_ = auVar82._0_4_;
                auVar86._0_4_ = local_900._0_4_ * local_900._0_4_;
                auVar86._4_4_ = local_900._4_4_ * local_900._4_4_;
                auVar86._8_4_ = local_900._8_4_ * local_900._8_4_;
                auVar86._12_4_ = local_900._12_4_ * local_900._12_4_;
                auVar82 = vdpps_avx(_local_7c0,auVar224,0x7f);
                auVar4 = vsubps_avx(auVar3,auVar86);
                auVar128 = vrsqrtss_avx(auVar4,auVar4);
                fVar236 = auVar4._0_4_;
                fVar124 = auVar128._0_4_;
                fVar124 = fVar124 * 1.5 + fVar236 * -0.5 * fVar124 * fVar124 * fVar124;
                auVar128 = vdpps_avx(_local_7c0,local_a20._0_16_,0x7f);
                local_9e0._0_16_ = ZEXT416((uint)(auVar169._0_4_ + auVar183._0_4_));
                auVar169 = vfnmadd231ss_fma(auVar82,local_900._0_16_,local_9e0._0_16_);
                auVar183 = vfnmadd231ss_fma(auVar128,local_900._0_16_,auVar217);
                if (fVar236 < 0.0) {
                  local_a40._0_16_ = auVar217;
                  local_6c0._0_16_ = auVar169;
                  local_6e0._0_4_ = fVar124;
                  local_700._0_16_ = auVar183;
                  fVar236 = sqrtf(fVar236);
                  fVar124 = (float)local_6e0._0_4_;
                  auVar183 = local_700._0_16_;
                  auVar217 = local_a40._0_16_;
                  auVar169 = local_6c0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar4,auVar4);
                  fVar236 = auVar82._0_4_;
                }
                auVar234 = ZEXT1664(auVar3);
                auVar228 = ZEXT3264(local_880);
                auVar254 = ZEXT3264(local_8a0);
                auVar211 = ZEXT3264(local_a00);
                auVar259 = ZEXT3264(local_8c0);
                auVar223 = ZEXT3264(local_8e0);
                auVar82 = vpermilps_avx(local_6a0._0_16_,0xff);
                fVar236 = fVar236 - auVar82._0_4_;
                auVar82 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
                auVar169 = vfmsub213ss_fma(auVar169,ZEXT416((uint)fVar124),auVar82);
                auVar155._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
                auVar155._8_4_ = auVar217._8_4_ ^ 0x80000000;
                auVar155._12_4_ = auVar217._12_4_ ^ 0x80000000;
                auVar173._0_8_ = auVar169._0_8_ ^ 0x8000000080000000;
                auVar173._8_4_ = auVar169._8_4_ ^ 0x80000000;
                auVar173._12_4_ = auVar169._12_4_ ^ 0x80000000;
                auVar128 = ZEXT416((uint)(auVar183._0_4_ * fVar124));
                auVar183 = vfmsub231ss_fma(ZEXT416((uint)(auVar169._0_4_ * auVar217._0_4_)),
                                           local_9e0._0_16_,auVar128);
                auVar169 = vinsertps_avx(auVar173,auVar128,0x1c);
                uVar73 = auVar183._0_4_;
                auVar174._4_4_ = uVar73;
                auVar174._0_4_ = uVar73;
                auVar174._8_4_ = uVar73;
                auVar174._12_4_ = uVar73;
                auVar169 = vdivps_avx(auVar169,auVar174);
                auVar183 = vinsertps_avx(local_9e0._0_16_,auVar155,0x10);
                auVar183 = vdivps_avx(auVar183,auVar174);
                fVar124 = local_900._0_4_;
                auVar129._0_4_ = fVar124 * auVar169._0_4_ + fVar236 * auVar183._0_4_;
                auVar129._4_4_ = fVar124 * auVar169._4_4_ + fVar236 * auVar183._4_4_;
                auVar129._8_4_ = fVar124 * auVar169._8_4_ + fVar236 * auVar183._8_4_;
                auVar129._12_4_ = fVar124 * auVar169._12_4_ + fVar236 * auVar183._12_4_;
                auVar183 = vsubps_avx(auVar192,auVar129);
                auVar199 = ZEXT1664(auVar183);
                auVar169 = vandps_avx(local_900._0_16_,local_920._0_16_);
              } while ((float)local_860._0_4_ <= auVar169._0_4_);
              auVar192 = vfmadd231ss_fma(ZEXT416((uint)((float)local_860._0_4_ +
                                                       (float)local_9c0._0_4_)),local_720._0_16_,
                                         ZEXT416(0x36000000));
              auVar169 = vandps_avx(ZEXT416((uint)fVar236),local_920._0_16_);
            } while (auVar192._0_4_ <= auVar169._0_4_);
            fVar124 = auVar183._0_4_ + (float)local_7a0._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar124) &&
               (fVar236 = (ray->super_RayK<1>).tfar, fVar124 <= fVar236)) {
              auVar169 = vmovshdup_avx(auVar183);
              fVar138 = auVar169._0_4_;
              if ((0.0 <= fVar138) && (fVar138 <= 1.0)) {
                auVar169 = vrsqrtss_avx(auVar3,auVar3);
                fVar237 = auVar169._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar229 = fVar237 * 1.5 + fVar229 * -0.5 * fVar237 * fVar237 * fVar237;
                  auVar156._0_4_ = fVar229 * (float)local_7c0._0_4_;
                  auVar156._4_4_ = fVar229 * (float)local_7c0._4_4_;
                  auVar156._8_4_ = fVar229 * fStack_7b8;
                  auVar156._12_4_ = fVar229 * fStack_7b4;
                  auVar192 = vfmadd213ps_fma(auVar82,auVar156,local_9a0._0_16_);
                  auVar169 = vshufps_avx(auVar156,auVar156,0xc9);
                  auVar183 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                  auVar157._0_4_ = auVar156._0_4_ * auVar183._0_4_;
                  auVar157._4_4_ = auVar156._4_4_ * auVar183._4_4_;
                  auVar157._8_4_ = auVar156._8_4_ * auVar183._8_4_;
                  auVar157._12_4_ = auVar156._12_4_ * auVar183._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar157,local_9a0._0_16_,auVar169);
                  auVar169 = vshufps_avx(auVar82,auVar82,0xc9);
                  auVar183 = vshufps_avx(auVar192,auVar192,0xc9);
                  auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                  auVar87._0_4_ = auVar192._0_4_ * auVar82._0_4_;
                  auVar87._4_4_ = auVar192._4_4_ * auVar82._4_4_;
                  auVar87._8_4_ = auVar192._8_4_ * auVar82._8_4_;
                  auVar87._12_4_ = auVar192._12_4_ * auVar82._12_4_;
                  auVar183 = vfmsub231ps_fma(auVar87,auVar169,auVar183);
                  auVar169 = vshufps_avx(auVar183,auVar183,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar124;
                    uVar77 = vmovlps_avx(auVar169);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar77;
                    (ray->Ng).field_0.field_0.z = auVar183._0_4_;
                    ray->u = fVar138;
                    ray->v = 0.0;
                    ray->primID = local_820._0_4_;
                    ray->geomID = uVar67;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_970 = vmovlps_avx(auVar169);
                    local_968 = auVar183._0_4_;
                    local_964 = fVar138;
                    local_960 = 0;
                    local_95c = local_820._0_4_;
                    local_958 = uVar67;
                    local_954 = context->user->instID[0];
                    local_950 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar124;
                    local_a84 = -1;
                    local_ab8.valid = &local_a84;
                    local_ab8.geometryUserPtr = pGVar6->userPtr;
                    local_ab8.context = context->user;
                    local_ab8.hit = (RTCHitN *)&local_970;
                    local_ab8.N = 1;
                    local_ab8.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012be863:
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar234 = ZEXT1664(auVar234._0_16_);
                        (*p_Var7)(&local_ab8);
                        auVar223 = ZEXT3264(local_8e0);
                        auVar259 = ZEXT3264(local_8c0);
                        auVar211 = ZEXT3264(local_a00);
                        auVar254 = ZEXT3264(local_8a0);
                        auVar228 = ZEXT3264(local_880);
                        if (*local_ab8.valid == 0) goto LAB_012be92c;
                      }
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                           *(float *)local_ab8.hit;
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_ab8.hit + 4);
                      (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_ab8.hit + 8);
                      *(float *)((long)local_ab8.ray + 0x3c) = *(float *)(local_ab8.hit + 0xc);
                      *(float *)((long)local_ab8.ray + 0x40) = *(float *)(local_ab8.hit + 0x10);
                      *(float *)((long)local_ab8.ray + 0x44) = *(float *)(local_ab8.hit + 0x14);
                      *(float *)((long)local_ab8.ray + 0x48) = *(float *)(local_ab8.hit + 0x18);
                      *(float *)((long)local_ab8.ray + 0x4c) = *(float *)(local_ab8.hit + 0x1c);
                      *(float *)((long)local_ab8.ray + 0x50) = *(float *)(local_ab8.hit + 0x20);
                    }
                    else {
                      auVar234 = ZEXT1664(auVar3);
                      (*pGVar6->intersectionFilterN)(&local_ab8);
                      auVar223 = ZEXT3264(local_8e0);
                      auVar259 = ZEXT3264(local_8c0);
                      auVar211 = ZEXT3264(local_a00);
                      auVar254 = ZEXT3264(local_8a0);
                      auVar228 = ZEXT3264(local_880);
                      if (*local_ab8.valid != 0) goto LAB_012be863;
LAB_012be92c:
                      (ray->super_RayK<1>).tfar = fVar236;
                    }
                  }
                }
              }
            }
LAB_012be726:
            fVar229 = (ray->super_RayK<1>).tfar;
            auVar97._4_4_ = fVar229;
            auVar97._0_4_ = fVar229;
            auVar97._8_4_ = fVar229;
            auVar97._12_4_ = fVar229;
            auVar97._16_4_ = fVar229;
            auVar97._20_4_ = fVar229;
            auVar97._24_4_ = fVar229;
            auVar97._28_4_ = fVar229;
            fVar124 = (ray->super_RayK<1>).tfar;
            auVar88 = vcmpps_avx(_local_740,auVar97,2);
            auVar88 = vandps_avx(auVar88,local_640);
            fVar229 = (float)local_800._0_4_;
            fVar236 = (float)local_800._4_4_;
            fVar237 = fStack_7f8;
            fVar238 = fStack_7f4;
            fVar239 = fStack_7f0;
            fVar240 = fStack_7ec;
            fVar241 = fStack_7e8;
            fVar242 = fStack_7e4;
          }
          auVar137._0_4_ = fVar229 + local_4e0._0_4_;
          auVar137._4_4_ = fVar236 + local_4e0._4_4_;
          auVar137._8_4_ = fVar237 + local_4e0._8_4_;
          auVar137._12_4_ = fVar238 + local_4e0._12_4_;
          auVar137._16_4_ = fVar239 + local_4e0._16_4_;
          auVar137._20_4_ = fVar240 + local_4e0._20_4_;
          auVar137._24_4_ = fVar241 + local_4e0._24_4_;
          auVar137._28_4_ = fVar242 + local_4e0._28_4_;
          auVar167._4_4_ = fVar124;
          auVar167._0_4_ = fVar124;
          auVar167._8_4_ = fVar124;
          auVar167._12_4_ = fVar124;
          auVar167._16_4_ = fVar124;
          auVar167._20_4_ = fVar124;
          auVar167._24_4_ = fVar124;
          auVar167._28_4_ = fVar124;
          auVar268 = vcmpps_avx(auVar137,auVar167,2);
          auVar88 = vandps_avx(_local_5e0,local_5c0);
          auVar88 = vandps_avx(auVar268,auVar88);
          auVar179._0_4_ = fVar229 + local_520._0_4_;
          auVar179._4_4_ = fVar236 + local_520._4_4_;
          auVar179._8_4_ = fVar237 + local_520._8_4_;
          auVar179._12_4_ = fVar238 + local_520._12_4_;
          auVar179._16_4_ = fVar239 + local_520._16_4_;
          auVar179._20_4_ = fVar240 + local_520._20_4_;
          auVar179._24_4_ = fVar241 + local_520._24_4_;
          auVar179._28_4_ = fVar242 + local_520._28_4_;
          auVar9 = vcmpps_avx(auVar179,auVar167,2);
          auVar268 = vandps_avx(_local_780,local_760);
          auVar268 = vandps_avx(auVar9,auVar268);
          auVar268 = vorps_avx(auVar88,auVar268);
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar268 >> 0xbf,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar268[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar69 * 0x60) = auVar268;
            auVar88 = vblendvps_avx(_local_520,local_4e0,auVar88);
            *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x60) = auVar88;
            uVar13 = vmovlps_avx(local_530);
            (&uStack_140)[uVar69 * 0xc] = uVar13;
            aiStack_138[uVar69 * 0x18] = local_b2c + 1;
            uVar69 = (ulong)((int)uVar69 + 1);
          }
          auVar214 = auVar228._0_32_;
          auVar228 = ZEXT3264(auVar211._0_32_);
          auVar211 = ZEXT3264(auVar259._0_32_);
          auVar259 = ZEXT3264(local_7e0);
          uVar73 = local_820._0_4_;
          goto LAB_012bd3b8;
        }
      }
      auVar259 = ZEXT3264(local_7e0);
      auVar254 = ZEXT3264(local_8a0);
      auVar228 = ZEXT3264(local_a00);
      auVar211 = ZEXT3264(local_8c0);
      auVar223 = ZEXT3264(local_8e0);
    }
LAB_012bd3b8:
    fVar124 = (ray->super_RayK<1>).tfar;
    auVar112._4_4_ = fVar124;
    auVar112._0_4_ = fVar124;
    auVar112._8_4_ = fVar124;
    auVar112._12_4_ = fVar124;
    auVar112._16_4_ = fVar124;
    auVar112._20_4_ = fVar124;
    auVar112._24_4_ = fVar124;
    auVar112._28_4_ = fVar124;
    while( true ) {
      uVar66 = (uint)uVar69;
      if (uVar66 == 0) {
        auVar88 = vcmpps_avx(local_3a0,auVar112,2);
        uVar67 = vmovmskps_avx(auVar88);
        uVar74 = (ulong)((uint)uVar74 & uVar67);
        goto LAB_012bc50c;
      }
      uVar69 = (ulong)(uVar66 - 1);
      lVar70 = uVar69 * 0x60;
      auVar88 = *(undefined1 (*) [32])(auStack_160 + lVar70);
      auVar91._0_4_ = fVar229 + auVar88._0_4_;
      auVar91._4_4_ = fVar236 + auVar88._4_4_;
      auVar91._8_4_ = fVar237 + auVar88._8_4_;
      auVar91._12_4_ = fVar238 + auVar88._12_4_;
      auVar91._16_4_ = fVar239 + auVar88._16_4_;
      auVar91._20_4_ = fVar240 + auVar88._20_4_;
      auVar91._24_4_ = fVar241 + auVar88._24_4_;
      auVar91._28_4_ = fVar242 + auVar88._28_4_;
      auVar9 = vcmpps_avx(auVar91,auVar112,2);
      auVar268 = vandps_avx(auVar9,*(undefined1 (*) [32])(auStack_180 + lVar70));
      local_4e0 = auVar268;
      auVar9 = *(undefined1 (*) [32])(auStack_180 + lVar70) & auVar9;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      break;
      uVar69 = (ulong)(uVar66 - 1);
    }
    auVar113._8_4_ = 0x7f800000;
    auVar113._0_8_ = 0x7f8000007f800000;
    auVar113._12_4_ = 0x7f800000;
    auVar113._16_4_ = 0x7f800000;
    auVar113._20_4_ = 0x7f800000;
    auVar113._24_4_ = 0x7f800000;
    auVar113._28_4_ = 0x7f800000;
    auVar88 = vblendvps_avx(auVar113,auVar88,auVar268);
    auVar9 = vshufps_avx(auVar88,auVar88,0xb1);
    auVar9 = vminps_avx(auVar88,auVar9);
    auVar10 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar10);
    auVar10 = vpermpd_avx2(auVar9,0x4e);
    auVar9 = vminps_avx(auVar9,auVar10);
    auVar88 = vcmpps_avx(auVar88,auVar9,0);
    auVar9 = auVar268 & auVar88;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0x7f,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar9 >> 0xbf,0) != '\0') ||
        (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0') {
      auVar268 = vandps_avx(auVar88,auVar268);
    }
    uVar71 = vmovmskps_avx(auVar268);
    iVar12 = 0;
    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
      iVar12 = iVar12 + 1;
    }
    *(undefined4 *)(local_4e0 + (uint)(iVar12 << 2)) = 0;
    uVar13 = (&uStack_140)[uVar69 * 0xc];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar13;
    local_b2c = aiStack_138[uVar69 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar70) = local_4e0;
    uVar71 = uVar66 - 1;
    if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4e0 >> 0x7f,0) != '\0') ||
          (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4e0 >> 0xbf,0) != '\0') ||
        (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4e0[0x1f] < '\0') {
      uVar71 = uVar66;
    }
    uVar76 = (undefined4)uVar13;
    auVar114._4_4_ = uVar76;
    auVar114._0_4_ = uVar76;
    auVar114._8_4_ = uVar76;
    auVar114._12_4_ = uVar76;
    auVar114._16_4_ = uVar76;
    auVar114._20_4_ = uVar76;
    auVar114._24_4_ = uVar76;
    auVar114._28_4_ = uVar76;
    auVar3 = vmovshdup_avx(auVar80);
    auVar3 = vsubps_avx(auVar3,auVar80);
    auVar92._0_4_ = auVar3._0_4_;
    auVar92._4_4_ = auVar92._0_4_;
    auVar92._8_4_ = auVar92._0_4_;
    auVar92._12_4_ = auVar92._0_4_;
    auVar92._16_4_ = auVar92._0_4_;
    auVar92._20_4_ = auVar92._0_4_;
    auVar92._24_4_ = auVar92._0_4_;
    auVar92._28_4_ = auVar92._0_4_;
    auVar3 = vfmadd132ps_fma(auVar92,auVar114,_DAT_01f7b040);
    _local_520 = ZEXT1632(auVar3);
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_520 + (uint)(iVar12 << 2));
    uVar69 = (ulong)uVar71;
    auVar209 = auVar211._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }